

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O1

bool embree::avx512::CurveNiIntersectorK<8,4>::
     occluded_n<embree::avx512::OrientedCurve1IntersectorK<embree::BezierCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar1;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar2;
  Primitive PVar3;
  uint uVar4;
  Geometry *pGVar5;
  RTCFilterFunctionN p_Var6;
  void *pvVar7;
  __int_type_conflict _Var8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  undefined8 uVar12;
  bool bVar13;
  undefined8 uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  byte bVar26;
  uint uVar27;
  ulong uVar28;
  uint uVar30;
  long lVar31;
  uint uVar32;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  ulong uVar33;
  uint uVar34;
  ulong uVar35;
  bool bVar36;
  bool bVar37;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar75 [32];
  undefined1 auVar77 [32];
  undefined1 auVar50 [16];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar93 [32];
  undefined1 auVar95 [32];
  undefined1 auVar97 [32];
  undefined1 auVar54 [16];
  undefined1 auVar99 [32];
  undefined1 auVar101 [32];
  int iVar103;
  float t1;
  float fVar104;
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  float fVar107;
  float fVar108;
  float fVar109;
  undefined4 uVar110;
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar122 [16];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  float fVar131;
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  vfloat4 b0;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  vfloat4 b0_1;
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [32];
  float fVar171;
  vfloat4 a0_3;
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [32];
  vfloat4 a0_2;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  float fVar190;
  float fVar201;
  float fVar202;
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  float fVar203;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  float fVar204;
  float fVar205;
  float fVar206;
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  float fVar217;
  float fVar225;
  float fVar226;
  vfloat4 a0_1;
  float fVar227;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  vfloat4 a0;
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [32];
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [64];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  int iVar246;
  undefined1 in_ZMM30 [64];
  undefined1 auVar247 [64];
  undefined1 in_ZMM31 [64];
  undefined1 auVar248 [64];
  uint mask_stack [4];
  RTCFilterFunctionNArguments args;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_489;
  undefined8 local_378;
  undefined8 uStack_370;
  undefined1 local_368 [16];
  undefined1 local_358 [16];
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined1 local_338 [16];
  undefined1 local_328 [16];
  uint auStack_318 [4];
  RTCFilterFunctionNArguments local_308;
  undefined1 local_2d8 [16];
  undefined1 local_2c8 [16];
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  undefined1 local_2a8 [16];
  undefined1 local_298 [16];
  undefined1 local_288 [16];
  undefined1 local_278 [16];
  undefined1 local_268 [8];
  float fStack_260;
  float fStack_25c;
  undefined1 local_258 [8];
  float fStack_250;
  float fStack_24c;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [8];
  float fStack_220;
  float fStack_21c;
  undefined1 local_218 [16];
  undefined1 local_208 [8];
  float fStack_200;
  float fStack_1fc;
  undefined1 local_1f8 [16];
  undefined1 local_1e8 [16];
  undefined1 local_1d8 [16];
  undefined1 local_1c8 [16];
  undefined1 local_1b8 [16];
  undefined1 local_1a8 [16];
  undefined1 local_198 [16];
  undefined1 local_188 [16];
  undefined1 local_178 [16];
  uint uStack_168;
  float afStack_164 [7];
  RTCHitN local_148 [16];
  undefined1 local_138 [16];
  undefined4 local_128;
  undefined4 uStack_124;
  undefined4 uStack_120;
  undefined4 uStack_11c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  undefined1 local_108 [16];
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined1 local_e8 [16];
  uint local_d8;
  uint uStack_d4;
  uint uStack_d0;
  uint uStack_cc;
  uint uStack_c8;
  uint uStack_c4;
  uint uStack_c0;
  uint uStack_bc;
  undefined1 local_b8 [32];
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  ulong auStack_58 [5];
  ulong uVar29;
  undefined1 auVar74 [32];
  undefined1 auVar76 [32];
  undefined1 auVar92 [32];
  undefined1 auVar94 [32];
  undefined1 auVar96 [32];
  undefined1 auVar98 [32];
  undefined1 auVar100 [32];
  undefined1 auVar102 [32];
  
  PVar3 = prim[1];
  uVar28 = (ulong)(byte)PVar3;
  fVar171 = *(float *)(prim + uVar28 * 0x19 + 0x12);
  auVar38 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar38 = vinsertps_avx(auVar38,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar49 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                          ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar105 = vinsertps_avx(auVar49,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar39 = vsubps_avx(auVar38,*(undefined1 (*) [16])(prim + uVar28 * 0x19 + 6));
  fVar131 = fVar171 * auVar39._0_4_;
  fVar104 = fVar171 * auVar105._0_4_;
  auVar38._8_8_ = 0;
  auVar38._0_8_ = *(ulong *)(prim + uVar28 * 4 + 6);
  auVar72 = vpmovsxbd_avx2(auVar38);
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar49._8_8_ = 0;
  auVar49._0_8_ = *(ulong *)(prim + uVar28 * 5 + 6);
  auVar70 = vpmovsxbd_avx2(auVar49);
  auVar70 = vcvtdq2ps_avx(auVar70);
  auVar48._8_8_ = 0;
  auVar48._0_8_ = *(ulong *)(prim + uVar28 * 6 + 6);
  auVar71 = vpmovsxbd_avx2(auVar48);
  auVar71 = vcvtdq2ps_avx(auVar71);
  auVar47._8_8_ = 0;
  auVar47._0_8_ = *(ulong *)(prim + uVar28 * 0xb + 6);
  auVar85 = vpmovsxbd_avx2(auVar47);
  auVar85 = vcvtdq2ps_avx(auVar85);
  auVar46._8_8_ = 0;
  auVar46._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar3 * 0xc) + 6);
  auVar86 = vpmovsxbd_avx2(auVar46);
  auVar86 = vcvtdq2ps_avx(auVar86);
  auVar45._8_8_ = 0;
  auVar45._0_8_ = *(ulong *)(prim + (uint)(byte)PVar3 * 0xc + uVar28 + 6);
  auVar87 = vpmovsxbd_avx2(auVar45);
  auVar87 = vcvtdq2ps_avx(auVar87);
  uVar35 = (ulong)(uint)((int)(uVar28 * 9) * 2);
  auVar44._8_8_ = 0;
  auVar44._0_8_ = *(ulong *)(prim + uVar35 + 6);
  auVar77 = vpmovsxbd_avx2(auVar44);
  auVar43._8_8_ = 0;
  auVar43._0_8_ = *(ulong *)(prim + uVar35 + uVar28 + 6);
  auVar80 = vpmovsxbd_avx2(auVar43);
  auVar77 = vcvtdq2ps_avx(auVar77);
  auVar78 = vcvtdq2ps_avx(auVar80);
  uVar33 = (ulong)(uint)((int)(uVar28 * 5) << 2);
  auVar42._8_8_ = 0;
  auVar42._0_8_ = *(ulong *)(prim + uVar33 + 6);
  auVar68 = vpmovsxbd_avx2(auVar42);
  auVar79 = vcvtdq2ps_avx(auVar68);
  auVar140._4_4_ = fVar104;
  auVar140._0_4_ = fVar104;
  auVar140._8_4_ = fVar104;
  auVar140._12_4_ = fVar104;
  auVar140._16_4_ = fVar104;
  auVar140._20_4_ = fVar104;
  auVar140._24_4_ = fVar104;
  auVar140._28_4_ = fVar104;
  auVar238._8_4_ = 1;
  auVar238._0_8_ = 0x100000001;
  auVar238._12_4_ = 1;
  auVar238._16_4_ = 1;
  auVar238._20_4_ = 1;
  auVar238._24_4_ = 1;
  auVar238._28_4_ = 1;
  auVar81 = ZEXT1632(CONCAT412(fVar171 * auVar105._12_4_,
                               CONCAT48(fVar171 * auVar105._8_4_,
                                        CONCAT44(fVar171 * auVar105._4_4_,fVar104))));
  auVar69 = vpermps_avx2(auVar238,auVar81);
  auVar66 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar67 = vpermps_avx512vl(auVar66,auVar81);
  fVar104 = auVar67._0_4_;
  fVar190 = auVar67._4_4_;
  auVar81._4_4_ = fVar190 * auVar71._4_4_;
  auVar81._0_4_ = fVar104 * auVar71._0_4_;
  fVar201 = auVar67._8_4_;
  auVar81._8_4_ = fVar201 * auVar71._8_4_;
  fVar202 = auVar67._12_4_;
  auVar81._12_4_ = fVar202 * auVar71._12_4_;
  fVar107 = auVar67._16_4_;
  auVar81._16_4_ = fVar107 * auVar71._16_4_;
  fVar108 = auVar67._20_4_;
  auVar81._20_4_ = fVar108 * auVar71._20_4_;
  fVar109 = auVar67._24_4_;
  auVar81._24_4_ = fVar109 * auVar71._24_4_;
  auVar81._28_4_ = auVar80._28_4_;
  auVar80._4_4_ = auVar87._4_4_ * fVar190;
  auVar80._0_4_ = auVar87._0_4_ * fVar104;
  auVar80._8_4_ = auVar87._8_4_ * fVar201;
  auVar80._12_4_ = auVar87._12_4_ * fVar202;
  auVar80._16_4_ = auVar87._16_4_ * fVar107;
  auVar80._20_4_ = auVar87._20_4_ * fVar108;
  auVar80._24_4_ = auVar87._24_4_ * fVar109;
  auVar80._28_4_ = auVar68._28_4_;
  auVar68._4_4_ = auVar79._4_4_ * fVar190;
  auVar68._0_4_ = auVar79._0_4_ * fVar104;
  auVar68._8_4_ = auVar79._8_4_ * fVar201;
  auVar68._12_4_ = auVar79._12_4_ * fVar202;
  auVar68._16_4_ = auVar79._16_4_ * fVar107;
  auVar68._20_4_ = auVar79._20_4_ * fVar108;
  auVar68._24_4_ = auVar79._24_4_ * fVar109;
  auVar68._28_4_ = auVar67._28_4_;
  auVar38 = vfmadd231ps_fma(auVar81,auVar69,auVar70);
  auVar49 = vfmadd231ps_fma(auVar80,auVar69,auVar86);
  auVar48 = vfmadd231ps_fma(auVar68,auVar78,auVar69);
  auVar38 = vfmadd231ps_fma(ZEXT1632(auVar38),auVar140,auVar72);
  auVar49 = vfmadd231ps_fma(ZEXT1632(auVar49),auVar140,auVar85);
  auVar48 = vfmadd231ps_fma(ZEXT1632(auVar48),auVar77,auVar140);
  auVar146._4_4_ = fVar131;
  auVar146._0_4_ = fVar131;
  auVar146._8_4_ = fVar131;
  auVar146._12_4_ = fVar131;
  auVar146._16_4_ = fVar131;
  auVar146._20_4_ = fVar131;
  auVar146._24_4_ = fVar131;
  auVar146._28_4_ = fVar131;
  auVar68 = ZEXT1632(CONCAT412(fVar171 * auVar39._12_4_,
                               CONCAT48(fVar171 * auVar39._8_4_,
                                        CONCAT44(fVar171 * auVar39._4_4_,fVar131))));
  auVar80 = vpermps_avx2(auVar238,auVar68);
  auVar68 = vpermps_avx512vl(auVar66,auVar68);
  auVar69 = vmulps_avx512vl(auVar68,auVar71);
  auVar83._0_4_ = auVar68._0_4_ * auVar87._0_4_;
  auVar83._4_4_ = auVar68._4_4_ * auVar87._4_4_;
  auVar83._8_4_ = auVar68._8_4_ * auVar87._8_4_;
  auVar83._12_4_ = auVar68._12_4_ * auVar87._12_4_;
  auVar83._16_4_ = auVar68._16_4_ * auVar87._16_4_;
  auVar83._20_4_ = auVar68._20_4_ * auVar87._20_4_;
  auVar83._24_4_ = auVar68._24_4_ * auVar87._24_4_;
  auVar83._28_4_ = 0;
  auVar87._4_4_ = auVar68._4_4_ * auVar79._4_4_;
  auVar87._0_4_ = auVar68._0_4_ * auVar79._0_4_;
  auVar87._8_4_ = auVar68._8_4_ * auVar79._8_4_;
  auVar87._12_4_ = auVar68._12_4_ * auVar79._12_4_;
  auVar87._16_4_ = auVar68._16_4_ * auVar79._16_4_;
  auVar87._20_4_ = auVar68._20_4_ * auVar79._20_4_;
  auVar87._24_4_ = auVar68._24_4_ * auVar79._24_4_;
  auVar87._28_4_ = auVar71._28_4_;
  auVar70 = vfmadd231ps_avx512vl(auVar69,auVar80,auVar70);
  auVar47 = vfmadd231ps_fma(auVar83,auVar80,auVar86);
  auVar46 = vfmadd231ps_fma(auVar87,auVar80,auVar78);
  auVar70 = vfmadd231ps_avx512vl(auVar70,auVar146,auVar72);
  auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar146,auVar85);
  auVar46 = vfmadd231ps_fma(ZEXT1632(auVar46),auVar146,auVar77);
  auVar88._8_4_ = 0x7fffffff;
  auVar88._0_8_ = 0x7fffffff7fffffff;
  auVar88._12_4_ = 0x7fffffff;
  auVar88._16_4_ = 0x7fffffff;
  auVar88._20_4_ = 0x7fffffff;
  auVar88._24_4_ = 0x7fffffff;
  auVar88._28_4_ = 0x7fffffff;
  auVar72 = vandps_avx(ZEXT1632(auVar38),auVar88);
  auVar90._8_4_ = 0x219392ef;
  auVar90._0_8_ = 0x219392ef219392ef;
  auVar90._12_4_ = 0x219392ef;
  auVar90._16_4_ = 0x219392ef;
  auVar90._20_4_ = 0x219392ef;
  auVar90._24_4_ = 0x219392ef;
  auVar90._28_4_ = 0x219392ef;
  uVar35 = vcmpps_avx512vl(auVar72,auVar90,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar69._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar69._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar69._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar69._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar38._12_4_;
  auVar69._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar69._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar69._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar69._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar49),auVar88);
  uVar35 = vcmpps_avx512vl(auVar72,auVar90,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar66._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar49._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar66._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar49._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar66._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar49._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar66._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar49._12_4_;
  auVar66._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar66._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar66._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar66._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar72 = vandps_avx(ZEXT1632(auVar48),auVar88);
  uVar35 = vcmpps_avx512vl(auVar72,auVar90,1);
  bVar36 = (bool)((byte)uVar35 & 1);
  auVar72._0_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._0_4_;
  bVar36 = (bool)((byte)(uVar35 >> 1) & 1);
  auVar72._4_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._4_4_;
  bVar36 = (bool)((byte)(uVar35 >> 2) & 1);
  auVar72._8_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._8_4_;
  bVar36 = (bool)((byte)(uVar35 >> 3) & 1);
  auVar72._12_4_ = (uint)bVar36 * 0x219392ef | (uint)!bVar36 * auVar48._12_4_;
  auVar72._16_4_ = (uint)((byte)(uVar35 >> 4) & 1) * 0x219392ef;
  auVar72._20_4_ = (uint)((byte)(uVar35 >> 5) & 1) * 0x219392ef;
  auVar72._24_4_ = (uint)((byte)(uVar35 >> 6) & 1) * 0x219392ef;
  auVar72._28_4_ = (uint)(byte)(uVar35 >> 7) * 0x219392ef;
  auVar71 = vrcp14ps_avx512vl(auVar69);
  auVar89._8_4_ = 0x3f800000;
  auVar89._0_8_ = &DAT_3f8000003f800000;
  auVar89._12_4_ = 0x3f800000;
  auVar89._16_4_ = 0x3f800000;
  auVar89._20_4_ = 0x3f800000;
  auVar89._24_4_ = 0x3f800000;
  auVar89._28_4_ = 0x3f800000;
  auVar38 = vfnmadd213ps_fma(auVar69,auVar71,auVar89);
  auVar38 = vfmadd132ps_fma(ZEXT1632(auVar38),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar66);
  auVar49 = vfnmadd213ps_fma(auVar66,auVar71,auVar89);
  auVar49 = vfmadd132ps_fma(ZEXT1632(auVar49),auVar71,auVar71);
  auVar71 = vrcp14ps_avx512vl(auVar72);
  auVar48 = vfnmadd213ps_fma(auVar72,auVar71,auVar89);
  auVar48 = vfmadd132ps_fma(ZEXT1632(auVar48),auVar71,auVar71);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 7 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar71 = vsubps_avx512vl(auVar72,auVar70);
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 9 + 6));
  auVar77._4_4_ = auVar38._4_4_ * auVar71._4_4_;
  auVar77._0_4_ = auVar38._0_4_ * auVar71._0_4_;
  auVar77._8_4_ = auVar38._8_4_ * auVar71._8_4_;
  auVar77._12_4_ = auVar38._12_4_ * auVar71._12_4_;
  auVar77._16_4_ = auVar71._16_4_ * 0.0;
  auVar77._20_4_ = auVar71._20_4_ * 0.0;
  auVar77._24_4_ = auVar71._24_4_ * 0.0;
  auVar77._28_4_ = auVar71._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx512vl(auVar72,auVar70);
  auVar84._0_4_ = auVar38._0_4_ * auVar72._0_4_;
  auVar84._4_4_ = auVar38._4_4_ * auVar72._4_4_;
  auVar84._8_4_ = auVar38._8_4_ * auVar72._8_4_;
  auVar84._12_4_ = auVar38._12_4_ * auVar72._12_4_;
  auVar84._16_4_ = auVar72._16_4_ * 0.0;
  auVar84._20_4_ = auVar72._20_4_ * 0.0;
  auVar84._24_4_ = auVar72._24_4_ * 0.0;
  auVar84._28_4_ = 0;
  auVar70 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar3 * 0x10 + 6));
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                            (prim + (ulong)(byte)PVar3 * 0x10 + uVar28 * -2 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar47));
  auVar78._4_4_ = auVar49._4_4_ * auVar72._4_4_;
  auVar78._0_4_ = auVar49._0_4_ * auVar72._0_4_;
  auVar78._8_4_ = auVar49._8_4_ * auVar72._8_4_;
  auVar78._12_4_ = auVar49._12_4_ * auVar72._12_4_;
  auVar78._16_4_ = auVar72._16_4_ * 0.0;
  auVar78._20_4_ = auVar72._20_4_ * 0.0;
  auVar78._24_4_ = auVar72._24_4_ * 0.0;
  auVar78._28_4_ = auVar72._28_4_;
  auVar72 = vcvtdq2ps_avx(auVar70);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar47));
  auVar82._0_4_ = auVar49._0_4_ * auVar72._0_4_;
  auVar82._4_4_ = auVar49._4_4_ * auVar72._4_4_;
  auVar82._8_4_ = auVar49._8_4_ * auVar72._8_4_;
  auVar82._12_4_ = auVar49._12_4_ * auVar72._12_4_;
  auVar82._16_4_ = auVar72._16_4_ * 0.0;
  auVar82._20_4_ = auVar72._20_4_ * 0.0;
  auVar82._24_4_ = auVar72._24_4_ * 0.0;
  auVar82._28_4_ = 0;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar33 + uVar28 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar46));
  auVar79._4_4_ = auVar72._4_4_ * auVar48._4_4_;
  auVar79._0_4_ = auVar72._0_4_ * auVar48._0_4_;
  auVar79._8_4_ = auVar72._8_4_ * auVar48._8_4_;
  auVar79._12_4_ = auVar72._12_4_ * auVar48._12_4_;
  auVar79._16_4_ = auVar72._16_4_ * 0.0;
  auVar79._20_4_ = auVar72._20_4_ * 0.0;
  auVar79._24_4_ = auVar72._24_4_ * 0.0;
  auVar79._28_4_ = auVar72._28_4_;
  auVar72 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar28 * 0x17 + 6));
  auVar72 = vcvtdq2ps_avx(auVar72);
  auVar72 = vsubps_avx(auVar72,ZEXT1632(auVar46));
  auVar67._0_4_ = auVar48._0_4_ * auVar72._0_4_;
  auVar67._4_4_ = auVar48._4_4_ * auVar72._4_4_;
  auVar67._8_4_ = auVar48._8_4_ * auVar72._8_4_;
  auVar67._12_4_ = auVar48._12_4_ * auVar72._12_4_;
  auVar67._16_4_ = auVar72._16_4_ * 0.0;
  auVar67._20_4_ = auVar72._20_4_ * 0.0;
  auVar67._24_4_ = auVar72._24_4_ * 0.0;
  auVar67._28_4_ = 0;
  auVar72 = vpminsd_avx2(auVar77,auVar84);
  auVar70 = vpminsd_avx2(auVar78,auVar82);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70 = vpminsd_avx2(auVar79,auVar67);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar71._4_4_ = uVar110;
  auVar71._0_4_ = uVar110;
  auVar71._8_4_ = uVar110;
  auVar71._12_4_ = uVar110;
  auVar71._16_4_ = uVar110;
  auVar71._20_4_ = uVar110;
  auVar71._24_4_ = uVar110;
  auVar71._28_4_ = uVar110;
  auVar70 = vmaxps_avx512vl(auVar70,auVar71);
  auVar72 = vmaxps_avx(auVar72,auVar70);
  auVar70._8_4_ = 0x3f7ffffa;
  auVar70._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar70._12_4_ = 0x3f7ffffa;
  auVar70._16_4_ = 0x3f7ffffa;
  auVar70._20_4_ = 0x3f7ffffa;
  auVar70._24_4_ = 0x3f7ffffa;
  auVar70._28_4_ = 0x3f7ffffa;
  local_b8 = vmulps_avx512vl(auVar72,auVar70);
  auVar72 = vpmaxsd_avx2(auVar77,auVar84);
  auVar70 = vpmaxsd_avx2(auVar78,auVar82);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar70 = vpmaxsd_avx2(auVar79,auVar67);
  uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar85._4_4_ = uVar110;
  auVar85._0_4_ = uVar110;
  auVar85._8_4_ = uVar110;
  auVar85._12_4_ = uVar110;
  auVar85._16_4_ = uVar110;
  auVar85._20_4_ = uVar110;
  auVar85._24_4_ = uVar110;
  auVar85._28_4_ = uVar110;
  auVar70 = vminps_avx512vl(auVar70,auVar85);
  auVar72 = vminps_avx(auVar72,auVar70);
  auVar86._8_4_ = 0x3f800003;
  auVar86._0_8_ = 0x3f8000033f800003;
  auVar86._12_4_ = 0x3f800003;
  auVar86._16_4_ = 0x3f800003;
  auVar86._20_4_ = 0x3f800003;
  auVar86._24_4_ = 0x3f800003;
  auVar86._28_4_ = 0x3f800003;
  auVar72 = vmulps_avx512vl(auVar72,auVar86);
  auVar70 = vpbroadcastd_avx512vl();
  uVar14 = vpcmpgtd_avx512vl(auVar70,_DAT_0205a920);
  uVar12 = vcmpps_avx512vl(local_b8,auVar72,2);
  bVar36 = (byte)((byte)uVar12 & (byte)uVar14) == 0;
  local_489 = !bVar36;
  if (bVar36) {
    return local_489;
  }
  uVar35 = (ulong)(byte)((byte)uVar12 & (byte)uVar14);
  local_2d8 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  auVar49 = auVar70._16_16_;
  auVar38 = vxorps_avx512vl(in_ZMM31._0_16_,in_ZMM31._0_16_);
  auVar248 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
  auVar240 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
  auVar241 = ZEXT1664(auVar38);
  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
  auVar242 = ZEXT1664(auVar38);
  auVar38 = vxorps_avx512vl(in_ZMM30._0_16_,in_ZMM30._0_16_);
  auVar247 = ZEXT1664(auVar38);
LAB_01d2db88:
  lVar31 = 0;
  for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    lVar31 = lVar31 + 1;
  }
  uVar34 = *(uint *)(prim + 2);
  pGVar5 = (context->scene->geometries).items[uVar34].ptr;
  uVar28 = (ulong)*(uint *)(*(long *)&pGVar5->field_0x58 +
                           pGVar5[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)*(uint *)(prim + lVar31 * 4 + 6));
  p_Var6 = pGVar5[1].intersectionFilterN;
  pvVar7 = pGVar5[2].userPtr;
  _Var8 = pGVar5[2].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  auVar38 = *(undefined1 (*) [16])(_Var8 + uVar28 * (long)pvVar7);
  auVar48 = *(undefined1 (*) [16])(_Var8 + (uVar28 + 1) * (long)pvVar7);
  auVar47 = *(undefined1 (*) [16])(_Var8 + (uVar28 + 2) * (long)pvVar7);
  auVar46 = *(undefined1 (*) [16])(_Var8 + (long)pvVar7 * (uVar28 + 3));
  lVar31 = *(long *)&pGVar5[1].time_range.upper;
  auVar45 = *(undefined1 (*) [16])(lVar31 + (long)p_Var6 * uVar28);
  auVar44 = *(undefined1 (*) [16])(lVar31 + (long)p_Var6 * (uVar28 + 1));
  auVar43 = *(undefined1 (*) [16])(lVar31 + (long)p_Var6 * (uVar28 + 2));
  uVar35 = uVar35 - 1 & uVar35;
  auVar42 = *(undefined1 (*) [16])(lVar31 + (long)p_Var6 * (uVar28 + 3));
  if (uVar35 != 0) {
    uVar33 = uVar35 - 1 & uVar35;
    for (uVar28 = uVar35; (uVar28 & 1) == 0; uVar28 = uVar28 >> 1 | 0x8000000000000000) {
    }
    if (uVar33 != 0) {
      for (; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar105 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                           0x1c);
  auVar105 = vinsertps_avx(auVar105,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  auVar111 = auVar248._0_16_;
  auVar39 = vmulps_avx512vl(auVar42,auVar111);
  auVar40 = vfmadd231ps_avx512vl(auVar39,auVar43,auVar111);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar44,auVar40);
  auVar120._0_4_ = auVar45._0_4_ + auVar39._0_4_;
  auVar120._4_4_ = auVar45._4_4_ + auVar39._4_4_;
  auVar120._8_4_ = auVar45._8_4_ + auVar39._8_4_;
  auVar120._12_4_ = auVar45._12_4_ + auVar39._12_4_;
  auVar121 = auVar240._0_16_;
  auVar39 = vfmadd231ps_avx512vl(auVar40,auVar44,auVar121);
  auVar40 = vfnmadd231ps_avx512vl(auVar39,auVar45,auVar121);
  auVar39 = vmulps_avx512vl(auVar46,auVar111);
  auVar41 = vfmadd231ps_avx512vl(auVar39,auVar47,auVar111);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar48,auVar41);
  auVar228._0_4_ = auVar38._0_4_ + auVar39._0_4_;
  auVar228._4_4_ = auVar38._4_4_ + auVar39._4_4_;
  auVar228._8_4_ = auVar38._8_4_ + auVar39._8_4_;
  auVar228._12_4_ = auVar38._12_4_ + auVar39._12_4_;
  auVar39 = vfmadd231ps_avx512vl(auVar41,auVar48,auVar121);
  auVar41 = vfnmadd231ps_avx512vl(auVar39,auVar38,auVar121);
  auVar39 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar43,auVar42);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar44,auVar111);
  auVar39 = vfmadd231ps_avx512vl(auVar39,auVar45,auVar111);
  auVar42 = vmulps_avx512vl(auVar42,auVar121);
  auVar43 = vfnmadd231ps_avx512vl(auVar42,auVar121,auVar43);
  auVar44 = vfmadd231ps_avx512vl(auVar43,auVar111,auVar44);
  auVar43 = vfnmadd231ps_avx512vl(auVar44,auVar111,auVar45);
  auVar45 = vfmadd213ps_fma(ZEXT816(0) << 0x20,auVar47,auVar46);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar48,auVar111);
  auVar45 = vfmadd231ps_avx512vl(auVar45,auVar38,auVar111);
  auVar46 = vmulps_avx512vl(auVar46,auVar121);
  auVar47 = vfnmadd231ps_avx512vl(auVar46,auVar121,auVar47);
  auVar48 = vfmadd231ps_avx512vl(auVar47,auVar111,auVar48);
  auVar44 = vfnmadd231ps_avx512vl(auVar48,auVar111,auVar38);
  auVar38 = vshufps_avx(auVar40,auVar40,0xc9);
  auVar48 = vshufps_avx(auVar228,auVar228,0xc9);
  fVar202 = auVar40._0_4_;
  auVar63._0_4_ = fVar202 * auVar48._0_4_;
  fVar107 = auVar40._4_4_;
  auVar63._4_4_ = fVar107 * auVar48._4_4_;
  fVar108 = auVar40._8_4_;
  auVar63._8_4_ = fVar108 * auVar48._8_4_;
  fVar109 = auVar40._12_4_;
  auVar63._12_4_ = fVar109 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar63,auVar38,auVar228);
  auVar47 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar41,auVar41,0xc9);
  auVar64._0_4_ = fVar202 * auVar48._0_4_;
  auVar64._4_4_ = fVar107 * auVar48._4_4_;
  auVar64._8_4_ = fVar108 * auVar48._8_4_;
  auVar64._12_4_ = fVar109 * auVar48._12_4_;
  auVar38 = vfmsub231ps_fma(auVar64,auVar38,auVar41);
  auVar46 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vshufps_avx(auVar43,auVar43,0xc9);
  auVar48 = vshufps_avx(auVar45,auVar45,0xc9);
  fVar131 = auVar43._0_4_;
  auVar53._0_4_ = fVar131 * auVar48._0_4_;
  fVar203 = auVar43._4_4_;
  auVar53._4_4_ = fVar203 * auVar48._4_4_;
  fVar204 = auVar43._8_4_;
  auVar53._8_4_ = fVar204 * auVar48._8_4_;
  fVar205 = auVar43._12_4_;
  auVar53._12_4_ = fVar205 * auVar48._12_4_;
  auVar48 = vfmsub231ps_fma(auVar53,auVar38,auVar45);
  auVar45 = vshufps_avx(auVar48,auVar48,0xc9);
  auVar48 = vshufps_avx(auVar44,auVar44,0xc9);
  auVar182._0_4_ = auVar48._0_4_ * fVar131;
  auVar182._4_4_ = auVar48._4_4_ * fVar203;
  auVar182._8_4_ = auVar48._8_4_ * fVar204;
  auVar182._12_4_ = auVar48._12_4_ * fVar205;
  auVar38 = vfmsub231ps_fma(auVar182,auVar38,auVar44);
  auVar44 = vshufps_avx(auVar38,auVar38,0xc9);
  auVar38 = vdpps_avx(auVar47,auVar47,0x7f);
  fVar171 = auVar38._0_4_;
  auVar74._16_16_ = auVar49;
  auVar74._0_16_ = auVar111;
  auVar73._4_28_ = auVar74._4_28_;
  auVar73._0_4_ = fVar171;
  auVar48 = vrsqrt14ss_avx512f(auVar111,auVar73._0_16_);
  fVar104 = auVar48._0_4_;
  auVar48 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar190 = fVar104 * 1.5 - auVar48._0_4_ * fVar104 * fVar104 * fVar104;
  fVar217 = fVar190 * auVar47._0_4_;
  fVar225 = fVar190 * auVar47._4_4_;
  fVar226 = fVar190 * auVar47._8_4_;
  fVar227 = fVar190 * auVar47._12_4_;
  auVar48 = vdpps_avx(auVar47,auVar46,0x7f);
  auVar191._0_4_ = auVar46._0_4_ * fVar171;
  auVar191._4_4_ = auVar46._4_4_ * fVar171;
  auVar191._8_4_ = auVar46._8_4_ * fVar171;
  auVar191._12_4_ = auVar46._12_4_ * fVar171;
  fVar171 = auVar48._0_4_;
  auVar159._0_4_ = fVar171 * auVar47._0_4_;
  auVar159._4_4_ = fVar171 * auVar47._4_4_;
  auVar159._8_4_ = fVar171 * auVar47._8_4_;
  auVar159._12_4_ = fVar171 * auVar47._12_4_;
  auVar48 = vsubps_avx(auVar191,auVar159);
  auVar47 = vrcp14ss_avx512f(auVar111,auVar73._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar47,ZEXT416(0x40000000));
  fVar171 = auVar47._0_4_ * auVar38._0_4_;
  auVar38 = vdpps_avx(auVar45,auVar45,0x7f);
  fVar104 = auVar38._0_4_;
  auVar76._16_16_ = auVar49;
  auVar76._0_16_ = auVar111;
  auVar75._4_28_ = auVar76._4_28_;
  auVar75._0_4_ = fVar104;
  auVar49 = vrsqrt14ss_avx512f(auVar111,auVar75._0_16_);
  fVar201 = auVar49._0_4_;
  auVar49 = vmulss_avx512f(auVar38,ZEXT416(0x3f000000));
  fVar201 = fVar201 * 1.5 - auVar49._0_4_ * fVar201 * fVar201 * fVar201;
  fVar206 = fVar201 * auVar45._0_4_;
  fVar214 = fVar201 * auVar45._4_4_;
  fVar215 = fVar201 * auVar45._8_4_;
  fVar216 = fVar201 * auVar45._12_4_;
  auVar49 = vdpps_avx(auVar45,auVar44,0x7f);
  auVar60._0_4_ = fVar104 * auVar44._0_4_;
  auVar60._4_4_ = fVar104 * auVar44._4_4_;
  auVar60._8_4_ = fVar104 * auVar44._8_4_;
  auVar60._12_4_ = fVar104 * auVar44._12_4_;
  fVar104 = auVar49._0_4_;
  auVar62._0_4_ = fVar104 * auVar45._0_4_;
  auVar62._4_4_ = fVar104 * auVar45._4_4_;
  auVar62._8_4_ = fVar104 * auVar45._8_4_;
  auVar62._12_4_ = fVar104 * auVar45._12_4_;
  auVar47 = vsubps_avx(auVar60,auVar62);
  auVar49 = vrcp14ss_avx512f(auVar111,auVar75._0_16_);
  auVar38 = vfnmadd213ss_avx512f(auVar38,auVar49,ZEXT416(0x40000000));
  fVar104 = auVar38._0_4_ * auVar49._0_4_;
  auVar38 = vshufps_avx(auVar120,auVar120,0xff);
  auVar172._0_4_ = fVar217 * auVar38._0_4_;
  auVar172._4_4_ = fVar225 * auVar38._4_4_;
  auVar172._8_4_ = fVar226 * auVar38._8_4_;
  auVar172._12_4_ = fVar227 * auVar38._12_4_;
  local_1f8 = vsubps_avx(auVar120,auVar172);
  auVar49 = vshufps_avx(auVar40,auVar40,0xff);
  auVar55._0_4_ = auVar49._0_4_ * fVar217 + auVar38._0_4_ * fVar190 * fVar171 * auVar48._0_4_;
  auVar55._4_4_ = auVar49._4_4_ * fVar225 + auVar38._4_4_ * fVar190 * fVar171 * auVar48._4_4_;
  auVar55._8_4_ = auVar49._8_4_ * fVar226 + auVar38._8_4_ * fVar190 * fVar171 * auVar48._8_4_;
  auVar55._12_4_ = auVar49._12_4_ * fVar227 + auVar38._12_4_ * fVar190 * fVar171 * auVar48._12_4_;
  auVar48 = vsubps_avx(auVar40,auVar55);
  local_208._0_4_ = auVar172._0_4_ + auVar120._0_4_;
  local_208._4_4_ = auVar172._4_4_ + auVar120._4_4_;
  fStack_200 = auVar172._8_4_ + auVar120._8_4_;
  fStack_1fc = auVar172._12_4_ + auVar120._12_4_;
  auVar38 = vshufps_avx(auVar39,auVar39,0xff);
  auVar56._0_4_ = fVar206 * auVar38._0_4_;
  auVar56._4_4_ = fVar214 * auVar38._4_4_;
  auVar56._8_4_ = fVar215 * auVar38._8_4_;
  auVar56._12_4_ = fVar216 * auVar38._12_4_;
  local_218 = vsubps_avx(auVar39,auVar56);
  auVar49 = vshufps_avx(auVar43,auVar43,0xff);
  auVar121._0_4_ = auVar49._0_4_ * fVar206 + auVar38._0_4_ * fVar201 * auVar47._0_4_ * fVar104;
  auVar121._4_4_ = auVar49._4_4_ * fVar214 + auVar38._4_4_ * fVar201 * auVar47._4_4_ * fVar104;
  auVar121._8_4_ = auVar49._8_4_ * fVar215 + auVar38._8_4_ * fVar201 * auVar47._8_4_ * fVar104;
  auVar121._12_4_ = auVar49._12_4_ * fVar216 + auVar38._12_4_ * fVar201 * auVar47._12_4_ * fVar104;
  auVar38 = vsubps_avx(auVar43,auVar121);
  _local_228 = vaddps_avx512vl(auVar39,auVar56);
  auVar132._0_4_ = auVar48._0_4_ * 0.33333334;
  auVar132._4_4_ = auVar48._4_4_ * 0.33333334;
  auVar132._8_4_ = auVar48._8_4_ * 0.33333334;
  auVar132._12_4_ = auVar48._12_4_ * 0.33333334;
  local_238 = vaddps_avx512vl(local_1f8,auVar132);
  auVar54._0_4_ = auVar38._0_4_ * 0.33333334;
  auVar54._4_4_ = auVar38._4_4_ * 0.33333334;
  auVar54._8_4_ = auVar38._8_4_ * 0.33333334;
  auVar54._12_4_ = auVar38._12_4_ * 0.33333334;
  local_248 = vsubps_avx512vl(local_218,auVar54);
  auVar39._0_4_ = (fVar202 + auVar55._0_4_) * 0.33333334;
  auVar39._4_4_ = (fVar107 + auVar55._4_4_) * 0.33333334;
  auVar39._8_4_ = (fVar108 + auVar55._8_4_) * 0.33333334;
  auVar39._12_4_ = (fVar109 + auVar55._12_4_) * 0.33333334;
  _local_258 = vaddps_avx512vl(_local_208,auVar39);
  auVar40._0_4_ = (fVar131 + auVar121._0_4_) * 0.33333334;
  auVar40._4_4_ = (fVar203 + auVar121._4_4_) * 0.33333334;
  auVar40._8_4_ = (fVar204 + auVar121._8_4_) * 0.33333334;
  auVar40._12_4_ = (fVar205 + auVar121._12_4_) * 0.33333334;
  _local_268 = vsubps_avx512vl(_local_228,auVar40);
  local_178 = vsubps_avx(local_1f8,auVar105);
  uVar110 = local_178._0_4_;
  auVar50._4_4_ = uVar110;
  auVar50._0_4_ = uVar110;
  auVar50._8_4_ = uVar110;
  auVar50._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_178,local_178,0x55);
  auVar49 = vshufps_avx(local_178,local_178,0xaa);
  aVar1 = pre->ray_space[k].vx.field_0;
  aVar2 = pre->ray_space[k].vy.field_0;
  fVar171 = pre->ray_space[k].vz.field_0.m128[0];
  fVar104 = pre->ray_space[k].vz.field_0.m128[1];
  fVar190 = pre->ray_space[k].vz.field_0.m128[2];
  fVar201 = pre->ray_space[k].vz.field_0.m128[3];
  auVar41._0_4_ = fVar171 * auVar49._0_4_;
  auVar41._4_4_ = fVar104 * auVar49._4_4_;
  auVar41._8_4_ = fVar190 * auVar49._8_4_;
  auVar41._12_4_ = fVar201 * auVar49._12_4_;
  auVar38 = vfmadd231ps_fma(auVar41,(undefined1  [16])aVar2,auVar38);
  auVar43 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar50);
  local_188 = vsubps_avx512vl(local_238,auVar105);
  uVar110 = local_188._0_4_;
  auVar52._4_4_ = uVar110;
  auVar52._0_4_ = uVar110;
  auVar52._8_4_ = uVar110;
  auVar52._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_188,local_188,0x55);
  auVar49 = vshufps_avx(local_188,local_188,0xaa);
  auVar51._0_4_ = fVar171 * auVar49._0_4_;
  auVar51._4_4_ = fVar104 * auVar49._4_4_;
  auVar51._8_4_ = fVar190 * auVar49._8_4_;
  auVar51._12_4_ = fVar201 * auVar49._12_4_;
  auVar38 = vfmadd231ps_fma(auVar51,(undefined1  [16])aVar2,auVar38);
  auVar42 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar52);
  local_198 = vsubps_avx512vl(local_248,auVar105);
  uVar110 = local_198._0_4_;
  auVar58._4_4_ = uVar110;
  auVar58._0_4_ = uVar110;
  auVar58._8_4_ = uVar110;
  auVar58._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_198,local_198,0x55);
  auVar49 = vshufps_avx(local_198,local_198,0xaa);
  auVar61._0_4_ = fVar171 * auVar49._0_4_;
  auVar61._4_4_ = fVar104 * auVar49._4_4_;
  auVar61._8_4_ = fVar190 * auVar49._8_4_;
  auVar61._12_4_ = fVar201 * auVar49._12_4_;
  auVar38 = vfmadd231ps_fma(auVar61,(undefined1  [16])aVar2,auVar38);
  auVar39 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar58);
  local_1a8 = vsubps_avx(local_218,auVar105);
  uVar110 = local_1a8._0_4_;
  auVar59._4_4_ = uVar110;
  auVar59._0_4_ = uVar110;
  auVar59._8_4_ = uVar110;
  auVar59._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_1a8,local_1a8,0x55);
  auVar49 = vshufps_avx(local_1a8,local_1a8,0xaa);
  auVar183._0_4_ = auVar49._0_4_ * fVar171;
  auVar183._4_4_ = auVar49._4_4_ * fVar104;
  auVar183._8_4_ = auVar49._8_4_ * fVar190;
  auVar183._12_4_ = auVar49._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar183,(undefined1  [16])aVar2,auVar38);
  auVar40 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar59);
  local_1b8 = vsubps_avx(_local_208,auVar105);
  uVar110 = local_1b8._0_4_;
  auVar65._4_4_ = uVar110;
  auVar65._0_4_ = uVar110;
  auVar65._8_4_ = uVar110;
  auVar65._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_1b8,local_1b8,0x55);
  auVar49 = vshufps_avx(local_1b8,local_1b8,0xaa);
  auVar192._0_4_ = auVar49._0_4_ * fVar171;
  auVar192._4_4_ = auVar49._4_4_ * fVar104;
  auVar192._8_4_ = auVar49._8_4_ * fVar190;
  auVar192._12_4_ = auVar49._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar192,(undefined1  [16])aVar2,auVar38);
  auVar41 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar65);
  local_1c8 = vsubps_avx512vl(_local_258,auVar105);
  uVar110 = local_1c8._0_4_;
  auVar160._4_4_ = uVar110;
  auVar160._0_4_ = uVar110;
  auVar160._8_4_ = uVar110;
  auVar160._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_1c8,local_1c8,0x55);
  auVar49 = vshufps_avx(local_1c8,local_1c8,0xaa);
  auVar207._0_4_ = auVar49._0_4_ * fVar171;
  auVar207._4_4_ = auVar49._4_4_ * fVar104;
  auVar207._8_4_ = auVar49._8_4_ * fVar190;
  auVar207._12_4_ = auVar49._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar207,(undefined1  [16])aVar2,auVar38);
  auVar120 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar160);
  local_1d8 = vsubps_avx512vl(_local_268,auVar105);
  uVar110 = local_1d8._0_4_;
  auVar161._4_4_ = uVar110;
  auVar161._0_4_ = uVar110;
  auVar161._8_4_ = uVar110;
  auVar161._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_1d8,local_1d8,0x55);
  auVar49 = vshufps_avx(local_1d8,local_1d8,0xaa);
  auVar218._0_4_ = auVar49._0_4_ * fVar171;
  auVar218._4_4_ = auVar49._4_4_ * fVar104;
  auVar218._8_4_ = auVar49._8_4_ * fVar190;
  auVar218._12_4_ = auVar49._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar218,(undefined1  [16])aVar2,auVar38);
  auVar121 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar161);
  local_1e8 = vsubps_avx512vl(_local_228,auVar105);
  uVar110 = local_1e8._0_4_;
  auVar105._4_4_ = uVar110;
  auVar105._0_4_ = uVar110;
  auVar105._8_4_ = uVar110;
  auVar105._12_4_ = uVar110;
  auVar38 = vshufps_avx(local_1e8,local_1e8,0x55);
  auVar49 = vshufps_avx(local_1e8,local_1e8,0xaa);
  auVar57._0_4_ = auVar49._0_4_ * fVar171;
  auVar57._4_4_ = auVar49._4_4_ * fVar104;
  auVar57._8_4_ = auVar49._8_4_ * fVar190;
  auVar57._12_4_ = auVar49._12_4_ * fVar201;
  auVar38 = vfmadd231ps_fma(auVar57,(undefined1  [16])aVar2,auVar38);
  auVar105 = vfmadd231ps_fma(auVar38,(undefined1  [16])aVar1,auVar105);
  auVar48 = vmovlhps_avx(auVar43,auVar41);
  auVar45 = vmovlhps_avx512f(auVar42,auVar120);
  auVar44 = vmovlhps_avx512f(auVar39,auVar121);
  _local_348 = vmovlhps_avx512f(auVar40,auVar105);
  auVar38 = vminps_avx512vl(auVar48,auVar45);
  auVar47 = vmaxps_avx512vl(auVar48,auVar45);
  auVar49 = vminps_avx512vl(auVar44,_local_348);
  auVar49 = vminps_avx(auVar38,auVar49);
  auVar38 = vmaxps_avx512vl(auVar44,_local_348);
  auVar38 = vmaxps_avx(auVar47,auVar38);
  auVar47 = vshufpd_avx(auVar49,auVar49,3);
  auVar46 = vshufpd_avx(auVar38,auVar38,3);
  auVar49 = vminps_avx(auVar49,auVar47);
  auVar38 = vmaxps_avx(auVar38,auVar46);
  auVar49 = vandps_avx512vl(auVar49,auVar241._0_16_);
  auVar38 = vandps_avx512vl(auVar38,auVar241._0_16_);
  auVar38 = vmaxps_avx(auVar49,auVar38);
  auVar49 = vmovshdup_avx(auVar38);
  auVar38 = vmaxss_avx(auVar49,auVar38);
  local_328._8_8_ = auVar43._0_8_;
  local_328._0_8_ = auVar43._0_8_;
  local_338 = vmovddup_avx512vl(auVar42);
  auVar111._8_8_ = auVar39._0_8_;
  auVar111._0_8_ = auVar39._0_8_;
  auVar122._8_8_ = auVar40._0_8_;
  auVar122._0_8_ = auVar40._0_8_;
  local_358 = ZEXT416((uint)(auVar38._0_4_ * 9.536743e-07));
  local_78 = vbroadcastss_avx512vl(local_358);
  auVar38 = vxorps_avx512vl(local_78._0_16_,auVar242._0_16_);
  local_98 = vbroadcastss_avx512vl(auVar38);
  local_278 = vpbroadcastd_avx512vl();
  bVar36 = false;
  uVar28 = 0;
  fVar171 = *(float *)(ray + k * 4 + 0x30);
  auVar47 = vsubps_avx512vl(auVar45,auVar48);
  auVar46 = vsubps_avx512vl(auVar44,auVar45);
  auVar43 = vsubps_avx512vl(_local_348,auVar44);
  local_288 = vsubps_avx(_local_208,local_1f8);
  local_298 = vsubps_avx512vl(_local_258,local_238);
  local_2a8 = vsubps_avx512vl(_local_268,local_248);
  _local_2b8 = vsubps_avx512vl(_local_228,local_218);
  local_2c8 = vpbroadcastd_avx512vl();
  auVar38 = ZEXT816(0x3f80000000000000);
  auVar239 = ZEXT1664(auVar38);
  do {
    auVar54 = auVar239._0_16_;
    auVar49 = vshufps_avx(auVar54,auVar54,0x50);
    auVar77 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar39 = vsubps_avx512vl(auVar77._0_16_,auVar49);
    fVar104 = auVar49._0_4_;
    fVar107 = auVar41._0_4_;
    auVar133._0_4_ = fVar107 * fVar104;
    fVar190 = auVar49._4_4_;
    fVar108 = auVar41._4_4_;
    auVar133._4_4_ = fVar108 * fVar190;
    fVar201 = auVar49._8_4_;
    auVar133._8_4_ = fVar107 * fVar201;
    fVar202 = auVar49._12_4_;
    auVar133._12_4_ = fVar108 * fVar202;
    fVar109 = auVar120._0_4_;
    auVar143._0_4_ = fVar109 * fVar104;
    fVar131 = auVar120._4_4_;
    auVar143._4_4_ = fVar131 * fVar190;
    auVar143._8_4_ = fVar109 * fVar201;
    auVar143._12_4_ = fVar131 * fVar202;
    fVar206 = auVar121._0_4_;
    auVar148._0_4_ = fVar206 * fVar104;
    fVar214 = auVar121._4_4_;
    auVar148._4_4_ = fVar214 * fVar190;
    auVar148._8_4_ = fVar206 * fVar201;
    auVar148._12_4_ = fVar214 * fVar202;
    fVar215 = auVar105._0_4_;
    auVar112._0_4_ = fVar215 * fVar104;
    fVar216 = auVar105._4_4_;
    auVar112._4_4_ = fVar216 * fVar190;
    auVar112._8_4_ = fVar215 * fVar201;
    auVar112._12_4_ = fVar216 * fVar202;
    auVar42 = vfmadd231ps_fma(auVar133,auVar39,local_328);
    auVar40 = vfmadd231ps_avx512vl(auVar143,auVar39,local_338);
    auVar50 = vfmadd231ps_avx512vl(auVar148,auVar39,auVar111);
    auVar39 = vfmadd231ps_fma(auVar112,auVar122,auVar39);
    auVar49 = vmovshdup_avx(auVar38);
    fVar190 = auVar38._0_4_;
    fVar104 = (auVar49._0_4_ - fVar190) * 0.04761905;
    auVar170._4_4_ = fVar190;
    auVar170._0_4_ = fVar190;
    auVar170._8_4_ = fVar190;
    auVar170._12_4_ = fVar190;
    auVar170._16_4_ = fVar190;
    auVar170._20_4_ = fVar190;
    auVar170._24_4_ = fVar190;
    auVar170._28_4_ = fVar190;
    auVar128._0_8_ = auVar49._0_8_;
    auVar128._8_8_ = auVar128._0_8_;
    auVar128._16_8_ = auVar128._0_8_;
    auVar128._24_8_ = auVar128._0_8_;
    auVar72 = vsubps_avx(auVar128,auVar170);
    uVar110 = auVar42._0_4_;
    auVar129._4_4_ = uVar110;
    auVar129._0_4_ = uVar110;
    auVar129._8_4_ = uVar110;
    auVar129._12_4_ = uVar110;
    auVar129._16_4_ = uVar110;
    auVar129._20_4_ = uVar110;
    auVar129._24_4_ = uVar110;
    auVar129._28_4_ = uVar110;
    auVar187._8_4_ = 1;
    auVar187._0_8_ = 0x100000001;
    auVar187._12_4_ = 1;
    auVar187._16_4_ = 1;
    auVar187._20_4_ = 1;
    auVar187._24_4_ = 1;
    auVar187._28_4_ = 1;
    auVar71 = ZEXT1632(auVar42);
    auVar70 = vpermps_avx2(auVar187,auVar71);
    auVar78 = vbroadcastss_avx512vl(auVar40);
    auVar85 = ZEXT1632(auVar40);
    auVar79 = vpermps_avx512vl(auVar187,auVar85);
    auVar80 = vbroadcastss_avx512vl(auVar50);
    auVar87 = ZEXT1632(auVar50);
    auVar68 = vpermps_avx512vl(auVar187,auVar87);
    auVar69 = vbroadcastss_avx512vl(auVar39);
    auVar83 = ZEXT1632(auVar39);
    auVar81 = vpermps_avx512vl(auVar187,auVar83);
    auVar188._4_4_ = fVar104;
    auVar188._0_4_ = fVar104;
    auVar188._8_4_ = fVar104;
    auVar188._12_4_ = fVar104;
    auVar188._16_4_ = fVar104;
    auVar188._20_4_ = fVar104;
    auVar188._24_4_ = fVar104;
    auVar188._28_4_ = fVar104;
    auVar231._8_4_ = 2;
    auVar231._0_8_ = 0x200000002;
    auVar231._12_4_ = 2;
    auVar231._16_4_ = 2;
    auVar231._20_4_ = 2;
    auVar231._24_4_ = 2;
    auVar231._28_4_ = 2;
    auVar66 = vpermps_avx512vl(auVar231,auVar71);
    auVar157._8_4_ = 3;
    auVar157._0_8_ = 0x300000003;
    auVar157._12_4_ = 3;
    auVar157._16_4_ = 3;
    auVar157._20_4_ = 3;
    auVar157._24_4_ = 3;
    auVar157._28_4_ = 3;
    auVar67 = vpermps_avx512vl(auVar157,auVar71);
    auVar71 = vpermps_avx2(auVar231,auVar85);
    auVar85 = vpermps_avx2(auVar157,auVar85);
    auVar86 = vpermps_avx2(auVar231,auVar87);
    auVar87 = vpermps_avx2(auVar157,auVar87);
    auVar82 = vpermps_avx512vl(auVar231,auVar83);
    auVar83 = vpermps_avx512vl(auVar157,auVar83);
    auVar49 = vfmadd132ps_fma(auVar72,auVar170,_DAT_02020f20);
    auVar77 = vsubps_avx512vl(auVar77,ZEXT1632(auVar49));
    auVar72 = vmulps_avx512vl(auVar78,ZEXT1632(auVar49));
    auVar88 = ZEXT1632(auVar49);
    auVar84 = vmulps_avx512vl(auVar79,auVar88);
    auVar42 = vfmadd231ps_fma(auVar72,auVar77,auVar129);
    auVar39 = vfmadd231ps_fma(auVar84,auVar77,auVar70);
    auVar72 = vmulps_avx512vl(auVar80,auVar88);
    auVar84 = vmulps_avx512vl(auVar68,auVar88);
    auVar72 = vfmadd231ps_avx512vl(auVar72,auVar77,auVar78);
    auVar78 = vfmadd231ps_avx512vl(auVar84,auVar77,auVar79);
    auVar79 = vmulps_avx512vl(auVar69,auVar88);
    auVar84 = ZEXT1632(auVar49);
    auVar81 = vmulps_avx512vl(auVar81,auVar84);
    auVar79 = vfmadd231ps_avx512vl(auVar79,auVar77,auVar80);
    auVar80 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar68);
    fVar201 = auVar49._0_4_;
    fVar202 = auVar49._4_4_;
    auVar17._4_4_ = fVar202 * auVar72._4_4_;
    auVar17._0_4_ = fVar201 * auVar72._0_4_;
    fVar203 = auVar49._8_4_;
    auVar17._8_4_ = fVar203 * auVar72._8_4_;
    fVar204 = auVar49._12_4_;
    auVar17._12_4_ = fVar204 * auVar72._12_4_;
    auVar17._16_4_ = auVar72._16_4_ * 0.0;
    auVar17._20_4_ = auVar72._20_4_ * 0.0;
    auVar17._24_4_ = auVar72._24_4_ * 0.0;
    auVar17._28_4_ = fVar190;
    auVar18._4_4_ = fVar202 * auVar78._4_4_;
    auVar18._0_4_ = fVar201 * auVar78._0_4_;
    auVar18._8_4_ = fVar203 * auVar78._8_4_;
    auVar18._12_4_ = fVar204 * auVar78._12_4_;
    auVar18._16_4_ = auVar78._16_4_ * 0.0;
    auVar18._20_4_ = auVar78._20_4_ * 0.0;
    auVar18._24_4_ = auVar78._24_4_ * 0.0;
    auVar18._28_4_ = auVar70._28_4_;
    auVar42 = vfmadd231ps_fma(auVar17,auVar77,ZEXT1632(auVar42));
    auVar39 = vfmadd231ps_fma(auVar18,auVar77,ZEXT1632(auVar39));
    auVar118._0_4_ = fVar201 * auVar79._0_4_;
    auVar118._4_4_ = fVar202 * auVar79._4_4_;
    auVar118._8_4_ = fVar203 * auVar79._8_4_;
    auVar118._12_4_ = fVar204 * auVar79._12_4_;
    auVar118._16_4_ = auVar79._16_4_ * 0.0;
    auVar118._20_4_ = auVar79._20_4_ * 0.0;
    auVar118._24_4_ = auVar79._24_4_ * 0.0;
    auVar118._28_4_ = 0;
    auVar19._4_4_ = fVar202 * auVar80._4_4_;
    auVar19._0_4_ = fVar201 * auVar80._0_4_;
    auVar19._8_4_ = fVar203 * auVar80._8_4_;
    auVar19._12_4_ = fVar204 * auVar80._12_4_;
    auVar19._16_4_ = auVar80._16_4_ * 0.0;
    auVar19._20_4_ = auVar80._20_4_ * 0.0;
    auVar19._24_4_ = auVar80._24_4_ * 0.0;
    auVar19._28_4_ = auVar79._28_4_;
    auVar40 = vfmadd231ps_fma(auVar118,auVar77,auVar72);
    auVar50 = vfmadd231ps_fma(auVar19,auVar77,auVar78);
    auVar20._28_4_ = auVar78._28_4_;
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar204 * auVar50._12_4_,
                            CONCAT48(fVar203 * auVar50._8_4_,
                                     CONCAT44(fVar202 * auVar50._4_4_,fVar201 * auVar50._0_4_))));
    auVar51 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar204 * auVar40._12_4_,
                                                 CONCAT48(fVar203 * auVar40._8_4_,
                                                          CONCAT44(fVar202 * auVar40._4_4_,
                                                                   fVar201 * auVar40._0_4_)))),
                              auVar77,ZEXT1632(auVar42));
    auVar132 = vfmadd231ps_fma(auVar20,auVar77,ZEXT1632(auVar39));
    auVar72 = vsubps_avx(ZEXT1632(auVar40),ZEXT1632(auVar42));
    auVar70 = vsubps_avx(ZEXT1632(auVar50),ZEXT1632(auVar39));
    auVar78 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar72 = vmulps_avx512vl(auVar72,auVar78);
    auVar70 = vmulps_avx512vl(auVar70,auVar78);
    auVar181._0_4_ = fVar104 * auVar72._0_4_;
    auVar181._4_4_ = fVar104 * auVar72._4_4_;
    auVar181._8_4_ = fVar104 * auVar72._8_4_;
    auVar181._12_4_ = fVar104 * auVar72._12_4_;
    auVar181._16_4_ = fVar104 * auVar72._16_4_;
    auVar181._20_4_ = fVar104 * auVar72._20_4_;
    auVar181._24_4_ = fVar104 * auVar72._24_4_;
    auVar181._28_4_ = 0;
    auVar72 = vmulps_avx512vl(auVar188,auVar70);
    auVar40 = vxorps_avx512vl(auVar69._0_16_,auVar69._0_16_);
    auVar79 = vpermt2ps_avx512vl(ZEXT1632(auVar51),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar80 = vpermt2ps_avx512vl(ZEXT1632(auVar132),_DAT_0205fd20,ZEXT1632(auVar40));
    auVar119._0_4_ = auVar181._0_4_ + auVar51._0_4_;
    auVar119._4_4_ = auVar181._4_4_ + auVar51._4_4_;
    auVar119._8_4_ = auVar181._8_4_ + auVar51._8_4_;
    auVar119._12_4_ = auVar181._12_4_ + auVar51._12_4_;
    auVar119._16_4_ = auVar181._16_4_ + 0.0;
    auVar119._20_4_ = auVar181._20_4_ + 0.0;
    auVar119._24_4_ = auVar181._24_4_ + 0.0;
    auVar119._28_4_ = 0;
    auVar88 = ZEXT1632(auVar40);
    auVar70 = vpermt2ps_avx512vl(auVar181,_DAT_0205fd20,auVar88);
    auVar68 = vaddps_avx512vl(ZEXT1632(auVar132),auVar72);
    auVar69 = vpermt2ps_avx512vl(auVar72,_DAT_0205fd20,auVar88);
    auVar72 = vsubps_avx(auVar79,auVar70);
    auVar69 = vsubps_avx512vl(auVar80,auVar69);
    auVar70 = vmulps_avx512vl(auVar71,auVar84);
    auVar81 = vmulps_avx512vl(auVar85,auVar84);
    auVar70 = vfmadd231ps_avx512vl(auVar70,auVar77,auVar66);
    auVar81 = vfmadd231ps_avx512vl(auVar81,auVar77,auVar67);
    auVar66 = vmulps_avx512vl(auVar86,auVar84);
    auVar67 = vmulps_avx512vl(auVar87,auVar84);
    auVar71 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar71);
    auVar85 = vfmadd231ps_avx512vl(auVar67,auVar77,auVar85);
    auVar66 = vmulps_avx512vl(auVar82,auVar84);
    auVar67 = vmulps_avx512vl(auVar83,auVar84);
    auVar42 = vfmadd231ps_fma(auVar66,auVar77,auVar86);
    auVar39 = vfmadd231ps_fma(auVar67,auVar77,auVar87);
    auVar66 = vmulps_avx512vl(auVar84,auVar71);
    auVar67 = vmulps_avx512vl(ZEXT1632(auVar49),auVar85);
    auVar70 = vfmadd231ps_avx512vl(auVar66,auVar77,auVar70);
    auVar81 = vfmadd231ps_avx512vl(auVar67,auVar77,auVar81);
    auVar71 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar204 * auVar42._12_4_,
                                            CONCAT48(fVar203 * auVar42._8_4_,
                                                     CONCAT44(fVar202 * auVar42._4_4_,
                                                              fVar201 * auVar42._0_4_)))),auVar77,
                         auVar71);
    auVar85 = vfmadd231ps_avx512vl
                        (ZEXT1632(CONCAT412(fVar204 * auVar39._12_4_,
                                            CONCAT48(fVar203 * auVar39._8_4_,
                                                     CONCAT44(fVar202 * auVar39._4_4_,
                                                              fVar201 * auVar39._0_4_)))),auVar77,
                         auVar85);
    auVar21._4_4_ = fVar202 * auVar71._4_4_;
    auVar21._0_4_ = fVar201 * auVar71._0_4_;
    auVar21._8_4_ = fVar203 * auVar71._8_4_;
    auVar21._12_4_ = fVar204 * auVar71._12_4_;
    auVar21._16_4_ = auVar71._16_4_ * 0.0;
    auVar21._20_4_ = auVar71._20_4_ * 0.0;
    auVar21._24_4_ = auVar71._24_4_ * 0.0;
    auVar21._28_4_ = auVar87._28_4_;
    auVar22._4_4_ = fVar202 * auVar85._4_4_;
    auVar22._0_4_ = fVar201 * auVar85._0_4_;
    auVar22._8_4_ = fVar203 * auVar85._8_4_;
    auVar22._12_4_ = fVar204 * auVar85._12_4_;
    auVar22._16_4_ = auVar85._16_4_ * 0.0;
    auVar22._20_4_ = auVar85._20_4_ * 0.0;
    auVar22._24_4_ = auVar85._24_4_ * 0.0;
    auVar22._28_4_ = auVar86._28_4_;
    auVar86 = vfmadd231ps_avx512vl(auVar21,auVar77,auVar70);
    auVar87 = vfmadd231ps_avx512vl(auVar22,auVar81,auVar77);
    auVar70 = vsubps_avx512vl(auVar71,auVar70);
    auVar71 = vsubps_avx512vl(auVar85,auVar81);
    auVar70 = vmulps_avx512vl(auVar70,auVar78);
    auVar71 = vmulps_avx512vl(auVar71,auVar78);
    fVar190 = fVar104 * auVar70._0_4_;
    fVar201 = fVar104 * auVar70._4_4_;
    auVar23._4_4_ = fVar201;
    auVar23._0_4_ = fVar190;
    fVar202 = fVar104 * auVar70._8_4_;
    auVar23._8_4_ = fVar202;
    fVar203 = fVar104 * auVar70._12_4_;
    auVar23._12_4_ = fVar203;
    fVar204 = fVar104 * auVar70._16_4_;
    auVar23._16_4_ = fVar204;
    fVar205 = fVar104 * auVar70._20_4_;
    auVar23._20_4_ = fVar205;
    fVar104 = fVar104 * auVar70._24_4_;
    auVar23._24_4_ = fVar104;
    auVar23._28_4_ = auVar70._28_4_;
    auVar71 = vmulps_avx512vl(auVar188,auVar71);
    auVar85 = vpermt2ps_avx512vl(auVar86,_DAT_0205fd20,auVar88);
    auVar77 = vpermt2ps_avx512vl(auVar87,_DAT_0205fd20,auVar88);
    auVar189._0_4_ = auVar86._0_4_ + fVar190;
    auVar189._4_4_ = auVar86._4_4_ + fVar201;
    auVar189._8_4_ = auVar86._8_4_ + fVar202;
    auVar189._12_4_ = auVar86._12_4_ + fVar203;
    auVar189._16_4_ = auVar86._16_4_ + fVar204;
    auVar189._20_4_ = auVar86._20_4_ + fVar205;
    auVar189._24_4_ = auVar86._24_4_ + fVar104;
    auVar189._28_4_ = auVar86._28_4_ + auVar70._28_4_;
    auVar70 = vpermt2ps_avx512vl(auVar23,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar78 = vaddps_avx512vl(auVar87,auVar71);
    auVar71 = vpermt2ps_avx512vl(auVar71,_DAT_0205fd20,ZEXT1632(auVar40));
    auVar70 = vsubps_avx(auVar85,auVar70);
    auVar71 = vsubps_avx512vl(auVar77,auVar71);
    auVar140 = ZEXT1632(auVar51);
    auVar81 = vsubps_avx512vl(auVar86,auVar140);
    auVar146 = ZEXT1632(auVar132);
    auVar66 = vsubps_avx512vl(auVar87,auVar146);
    auVar67 = vsubps_avx512vl(auVar85,auVar79);
    auVar81 = vaddps_avx512vl(auVar81,auVar67);
    auVar67 = vsubps_avx512vl(auVar77,auVar80);
    auVar66 = vaddps_avx512vl(auVar66,auVar67);
    auVar67 = vmulps_avx512vl(auVar146,auVar81);
    auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar140,auVar66);
    auVar82 = vmulps_avx512vl(auVar68,auVar81);
    auVar82 = vfnmadd231ps_avx512vl(auVar82,auVar119,auVar66);
    auVar83 = vmulps_avx512vl(auVar69,auVar81);
    auVar83 = vfnmadd231ps_avx512vl(auVar83,auVar72,auVar66);
    auVar84 = vmulps_avx512vl(auVar80,auVar81);
    auVar84 = vfnmadd231ps_avx512vl(auVar84,auVar79,auVar66);
    auVar88 = vmulps_avx512vl(auVar87,auVar81);
    auVar88 = vfnmadd231ps_avx512vl(auVar88,auVar86,auVar66);
    auVar89 = vmulps_avx512vl(auVar78,auVar81);
    auVar89 = vfnmadd231ps_avx512vl(auVar89,auVar189,auVar66);
    auVar90 = vmulps_avx512vl(auVar71,auVar81);
    auVar90 = vfnmadd231ps_avx512vl(auVar90,auVar70,auVar66);
    auVar81 = vmulps_avx512vl(auVar77,auVar81);
    auVar81 = vfnmadd231ps_avx512vl(auVar81,auVar85,auVar66);
    auVar66 = vminps_avx512vl(auVar67,auVar82);
    auVar67 = vmaxps_avx512vl(auVar67,auVar82);
    auVar82 = vminps_avx512vl(auVar83,auVar84);
    auVar66 = vminps_avx512vl(auVar66,auVar82);
    auVar82 = vmaxps_avx512vl(auVar83,auVar84);
    auVar67 = vmaxps_avx512vl(auVar67,auVar82);
    auVar82 = vminps_avx512vl(auVar88,auVar89);
    auVar83 = vmaxps_avx512vl(auVar88,auVar89);
    auVar84 = vminps_avx512vl(auVar90,auVar81);
    auVar82 = vminps_avx512vl(auVar82,auVar84);
    auVar66 = vminps_avx512vl(auVar66,auVar82);
    auVar81 = vmaxps_avx512vl(auVar90,auVar81);
    auVar81 = vmaxps_avx512vl(auVar83,auVar81);
    auVar81 = vmaxps_avx512vl(auVar67,auVar81);
    uVar12 = vcmpps_avx512vl(auVar66,local_78,2);
    uVar14 = vcmpps_avx512vl(auVar81,local_98,5);
    uVar30 = 0;
    bVar26 = (byte)uVar12 & (byte)uVar14 & 0x7f;
    if (bVar26 != 0) {
      auVar81 = vsubps_avx512vl(auVar79,auVar140);
      auVar66 = vsubps_avx512vl(auVar80,auVar146);
      auVar67 = vsubps_avx512vl(auVar85,auVar86);
      auVar81 = vaddps_avx512vl(auVar81,auVar67);
      auVar67 = vsubps_avx512vl(auVar77,auVar87);
      auVar66 = vaddps_avx512vl(auVar66,auVar67);
      auVar67 = vmulps_avx512vl(auVar146,auVar81);
      auVar67 = vfnmadd231ps_avx512vl(auVar67,auVar66,auVar140);
      auVar68 = vmulps_avx512vl(auVar68,auVar81);
      auVar68 = vfnmadd213ps_avx512vl(auVar119,auVar66,auVar68);
      auVar69 = vmulps_avx512vl(auVar69,auVar81);
      auVar69 = vfnmadd213ps_avx512vl(auVar72,auVar66,auVar69);
      auVar72 = vmulps_avx512vl(auVar80,auVar81);
      auVar79 = vfnmadd231ps_avx512vl(auVar72,auVar66,auVar79);
      auVar72 = vmulps_avx512vl(auVar87,auVar81);
      auVar86 = vfnmadd231ps_avx512vl(auVar72,auVar66,auVar86);
      auVar72 = vmulps_avx512vl(auVar78,auVar81);
      auVar87 = vfnmadd213ps_avx512vl(auVar189,auVar66,auVar72);
      auVar72 = vmulps_avx512vl(auVar71,auVar81);
      auVar78 = vfnmadd213ps_avx512vl(auVar70,auVar66,auVar72);
      auVar72 = vmulps_avx512vl(auVar77,auVar81);
      auVar77 = vfnmadd231ps_avx512vl(auVar72,auVar85,auVar66);
      auVar70 = vminps_avx(auVar67,auVar68);
      auVar72 = vmaxps_avx(auVar67,auVar68);
      auVar71 = vminps_avx(auVar69,auVar79);
      auVar71 = vminps_avx(auVar70,auVar71);
      auVar70 = vmaxps_avx(auVar69,auVar79);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      auVar85 = vminps_avx(auVar86,auVar87);
      auVar70 = vmaxps_avx(auVar86,auVar87);
      auVar86 = vminps_avx(auVar78,auVar77);
      auVar85 = vminps_avx(auVar85,auVar86);
      auVar85 = vminps_avx(auVar71,auVar85);
      auVar71 = vmaxps_avx(auVar78,auVar77);
      auVar70 = vmaxps_avx(auVar70,auVar71);
      auVar72 = vmaxps_avx(auVar72,auVar70);
      uVar12 = vcmpps_avx512vl(auVar72,local_98,5);
      uVar14 = vcmpps_avx512vl(auVar85,local_78,2);
      uVar30 = (uint)(bVar26 & (byte)uVar12 & (byte)uVar14);
    }
    if (uVar30 != 0) {
      auStack_318[uVar28] = uVar30;
      uVar12 = vmovlps_avx(auVar38);
      *(undefined8 *)(&uStack_168 + uVar28 * 2) = uVar12;
      uVar33 = vmovlps_avx512f(auVar54);
      auStack_58[uVar28] = uVar33;
      uVar28 = (ulong)((int)uVar28 + 1);
    }
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar240 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
    auVar241 = ZEXT1664(auVar38);
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar242 = ZEXT1664(auVar38);
    auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
    auVar243 = ZEXT3264(auVar72);
    auVar244 = ZEXT464(0x3f800000);
    auVar49 = auVar72._16_16_;
    auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar245 = ZEXT1664(auVar38);
    do {
      auVar39 = auVar248._0_16_;
      auVar38 = auVar240._0_16_;
      auVar42 = auVar245._0_16_;
      if ((int)uVar28 == 0) {
        if (bVar36) {
          return local_489;
        }
        uVar110 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar16._4_4_ = uVar110;
        auVar16._0_4_ = uVar110;
        auVar16._8_4_ = uVar110;
        auVar16._12_4_ = uVar110;
        auVar16._16_4_ = uVar110;
        auVar16._20_4_ = uVar110;
        auVar16._24_4_ = uVar110;
        auVar16._28_4_ = uVar110;
        uVar12 = vcmpps_avx512vl(local_b8,auVar16,2);
        uVar34 = (uint)uVar35 & (uint)uVar12;
        uVar35 = (ulong)uVar34;
        local_489 = uVar34 != 0;
        if (!local_489) {
          return local_489;
        }
        goto LAB_01d2db88;
      }
      uVar27 = (int)uVar28 - 1;
      uVar29 = (ulong)uVar27;
      uVar30 = (&uStack_168)[uVar29 * 2];
      fVar104 = afStack_164[uVar29 * 2];
      uVar4 = auStack_318[uVar29];
      auVar237._8_8_ = 0;
      auVar237._0_8_ = auStack_58[uVar29];
      auVar239 = ZEXT1664(auVar237);
      lVar31 = 0;
      for (uVar33 = (ulong)uVar4; (uVar33 & 1) == 0; uVar33 = uVar33 >> 1 | 0x8000000000000000) {
        lVar31 = lVar31 + 1;
      }
      uVar32 = uVar4 - 1 & uVar4;
      auStack_318[uVar29] = uVar32;
      if (uVar32 == 0) {
        uVar28 = (ulong)uVar27;
      }
      auVar123._0_4_ = (float)lVar31;
      auVar123._4_8_ = SUB128(ZEXT812(0),4);
      auVar123._12_4_ = 0;
      auVar49 = vmulss_avx512f(auVar123,SUB6416(ZEXT464(0x3e124925),0));
      lVar31 = lVar31 + 1;
      auVar134._0_4_ = (float)lVar31;
      auVar134._4_8_ = SUB128(ZEXT812(0),4);
      auVar134._12_4_ = 0;
      auVar40 = vmulss_avx512f(auVar134,SUB6416(ZEXT464(0x3e124925),0));
      auVar132 = auVar244._0_16_;
      auVar50 = vsubss_avx512f(auVar132,auVar49);
      auVar49 = vmulss_avx512f(ZEXT416((uint)fVar104),auVar49);
      auVar50 = vfmadd231ss_avx512f(auVar49,ZEXT416(uVar30),auVar50);
      auVar49 = vsubss_avx512f(auVar132,auVar40);
      auVar40 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar40._0_4_)),ZEXT416(uVar30),auVar49);
      auVar51 = vsubss_avx512f(auVar40,auVar50);
      vucomiss_avx512f(auVar51);
      if (uVar4 == 0 || lVar31 == 0) break;
      auVar49 = vshufps_avx(auVar237,auVar237,0x50);
      vucomiss_avx512f(auVar51);
      auVar52 = vsubps_avx512vl(auVar42,auVar49);
      fVar104 = auVar49._0_4_;
      auVar135._0_4_ = fVar107 * fVar104;
      fVar190 = auVar49._4_4_;
      auVar135._4_4_ = fVar108 * fVar190;
      fVar201 = auVar49._8_4_;
      auVar135._8_4_ = fVar107 * fVar201;
      fVar202 = auVar49._12_4_;
      auVar135._12_4_ = fVar108 * fVar202;
      auVar144._0_4_ = fVar109 * fVar104;
      auVar144._4_4_ = fVar131 * fVar190;
      auVar144._8_4_ = fVar109 * fVar201;
      auVar144._12_4_ = fVar131 * fVar202;
      auVar149._0_4_ = fVar206 * fVar104;
      auVar149._4_4_ = fVar214 * fVar190;
      auVar149._8_4_ = fVar206 * fVar201;
      auVar149._12_4_ = fVar214 * fVar202;
      auVar113._0_4_ = fVar215 * fVar104;
      auVar113._4_4_ = fVar216 * fVar190;
      auVar113._8_4_ = fVar215 * fVar201;
      auVar113._12_4_ = fVar216 * fVar202;
      auVar49 = vfmadd231ps_fma(auVar135,auVar52,local_328);
      auVar54 = vfmadd231ps_fma(auVar144,auVar52,local_338);
      auVar53 = vfmadd231ps_avx512vl(auVar149,auVar52,auVar111);
      auVar52 = vfmadd231ps_fma(auVar113,auVar122,auVar52);
      auVar130._16_16_ = auVar49;
      auVar130._0_16_ = auVar49;
      auVar141._16_16_ = auVar54;
      auVar141._0_16_ = auVar54;
      auVar147._16_16_ = auVar53;
      auVar147._0_16_ = auVar53;
      auVar158._0_4_ = auVar50._0_4_;
      auVar158._4_4_ = auVar158._0_4_;
      auVar158._8_4_ = auVar158._0_4_;
      auVar158._12_4_ = auVar158._0_4_;
      uVar110 = auVar40._0_4_;
      auVar158._20_4_ = uVar110;
      auVar158._16_4_ = uVar110;
      auVar158._24_4_ = uVar110;
      auVar158._28_4_ = uVar110;
      auVar72 = vsubps_avx(auVar141,auVar130);
      auVar54 = vfmadd213ps_fma(auVar72,auVar158,auVar130);
      auVar72 = vsubps_avx(auVar147,auVar141);
      auVar61 = vfmadd213ps_fma(auVar72,auVar158,auVar141);
      auVar49 = vsubps_avx(auVar52,auVar53);
      auVar142._16_16_ = auVar49;
      auVar142._0_16_ = auVar49;
      auVar49 = vfmadd213ps_fma(auVar142,auVar158,auVar147);
      auVar72 = vsubps_avx(ZEXT1632(auVar61),ZEXT1632(auVar54));
      auVar54 = vfmadd213ps_fma(auVar72,auVar158,ZEXT1632(auVar54));
      auVar72 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar61));
      auVar49 = vfmadd213ps_fma(auVar72,auVar158,ZEXT1632(auVar61));
      auVar72 = vsubps_avx(ZEXT1632(auVar49),ZEXT1632(auVar54));
      auVar59 = vfmadd231ps_fma(ZEXT1632(auVar54),auVar72,auVar158);
      auVar72 = vmulps_avx512vl(auVar72,auVar243._0_32_);
      auVar49 = auVar72._16_16_;
      fVar104 = auVar51._0_4_ * 0.33333334;
      auVar150._0_8_ =
           CONCAT44(auVar59._4_4_ + fVar104 * auVar72._4_4_,auVar59._0_4_ + fVar104 * auVar72._0_4_)
      ;
      auVar150._8_4_ = auVar59._8_4_ + fVar104 * auVar72._8_4_;
      auVar150._12_4_ = auVar59._12_4_ + fVar104 * auVar72._12_4_;
      auVar136._0_4_ = fVar104 * auVar72._16_4_;
      auVar136._4_4_ = fVar104 * auVar72._20_4_;
      auVar136._8_4_ = fVar104 * auVar72._24_4_;
      auVar136._12_4_ = fVar104 * auVar72._28_4_;
      auVar159 = vsubps_avx((undefined1  [16])0x0,auVar136);
      auVar64 = vshufpd_avx(auVar59,auVar59,3);
      auVar60 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,3);
      auVar54 = vsubps_avx(auVar64,auVar59);
      auVar52 = vsubps_avx(auVar60,(undefined1  [16])0x0);
      auVar162._0_4_ = auVar52._0_4_ + auVar54._0_4_;
      auVar162._4_4_ = auVar52._4_4_ + auVar54._4_4_;
      auVar162._8_4_ = auVar52._8_4_ + auVar54._8_4_;
      auVar162._12_4_ = auVar52._12_4_ + auVar54._12_4_;
      auVar54 = vshufps_avx(auVar59,auVar59,0xb1);
      auVar52 = vshufps_avx(auVar150,auVar150,0xb1);
      auVar61 = vshufps_avx(auVar159,auVar159,0xb1);
      auVar53 = vshufps_avx((undefined1  [16])0x0,(undefined1  [16])0x0,0xb1);
      auVar219._4_4_ = auVar162._0_4_;
      auVar219._0_4_ = auVar162._0_4_;
      auVar219._8_4_ = auVar162._0_4_;
      auVar219._12_4_ = auVar162._0_4_;
      auVar62 = vshufps_avx(auVar162,auVar162,0x55);
      fVar104 = auVar62._0_4_;
      auVar173._0_4_ = auVar54._0_4_ * fVar104;
      fVar190 = auVar62._4_4_;
      auVar173._4_4_ = auVar54._4_4_ * fVar190;
      fVar201 = auVar62._8_4_;
      auVar173._8_4_ = auVar54._8_4_ * fVar201;
      fVar202 = auVar62._12_4_;
      auVar173._12_4_ = auVar54._12_4_ * fVar202;
      auVar184._0_4_ = auVar52._0_4_ * fVar104;
      auVar184._4_4_ = auVar52._4_4_ * fVar190;
      auVar184._8_4_ = auVar52._8_4_ * fVar201;
      auVar184._12_4_ = auVar52._12_4_ * fVar202;
      auVar193._0_4_ = auVar61._0_4_ * fVar104;
      auVar193._4_4_ = auVar61._4_4_ * fVar190;
      auVar193._8_4_ = auVar61._8_4_ * fVar201;
      auVar193._12_4_ = auVar61._12_4_ * fVar202;
      auVar163._0_4_ = auVar53._0_4_ * fVar104;
      auVar163._4_4_ = auVar53._4_4_ * fVar190;
      auVar163._8_4_ = auVar53._8_4_ * fVar201;
      auVar163._12_4_ = auVar53._12_4_ * fVar202;
      auVar54 = vfmadd231ps_fma(auVar173,auVar219,auVar59);
      auVar52 = vfmadd231ps_fma(auVar184,auVar219,auVar150);
      auVar62 = vfmadd231ps_fma(auVar193,auVar219,auVar159);
      auVar58 = vfmadd231ps_fma(auVar163,(undefined1  [16])0x0,auVar219);
      auVar63 = vshufpd_avx(auVar54,auVar54,1);
      auVar55 = vshufpd_avx(auVar52,auVar52,1);
      auVar56 = vshufpd_avx(auVar62,auVar62,1);
      auVar57 = vshufpd_avx(auVar58,auVar58,1);
      auVar61 = vminss_avx(auVar54,auVar52);
      auVar54 = vmaxss_avx(auVar52,auVar54);
      auVar53 = vminss_avx(auVar62,auVar58);
      auVar52 = vmaxss_avx(auVar58,auVar62);
      auVar53 = vminss_avx(auVar61,auVar53);
      auVar54 = vmaxss_avx(auVar52,auVar54);
      auVar62 = vminss_avx(auVar63,auVar55);
      auVar52 = vmaxss_avx(auVar55,auVar63);
      auVar63 = vminss_avx(auVar56,auVar57);
      auVar61 = vmaxss_avx(auVar57,auVar56);
      auVar62 = vminss_avx(auVar62,auVar63);
      auVar52 = vmaxss_avx(auVar61,auVar52);
      fVar201 = auVar53._0_4_;
      fVar190 = auVar52._0_4_;
      fVar104 = auVar54._0_4_;
      if ((0.0001 <= fVar201) || (fVar190 <= -0.0001)) {
        uVar12 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),1);
        uVar14 = vcmpps_avx512vl(auVar53,SUB6416(ZEXT464(0x38d1b717),0),1);
        if ((-0.0001 < fVar104 & ((byte)uVar14 | (byte)uVar12)) != 0) goto LAB_01d2eac9;
        uVar12 = vcmpps_avx512vl(SUB6416(ZEXT464(0xb8d1b717),0),auVar52,5);
        uVar14 = vcmpps_avx512vl(auVar62,SUB6416(ZEXT464(0x38d1b717),0),5);
        if ((((ushort)uVar14 | (ushort)uVar12) & 1) == 0) goto LAB_01d2eac9;
        bVar13 = true;
        auVar239 = ZEXT1664(auVar237);
      }
      else {
LAB_01d2eac9:
        auVar55 = auVar247._0_16_;
        uVar12 = vcmpss_avx512f(auVar53,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        iVar103 = auVar244._0_4_;
        fVar202 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar103);
        uVar12 = vcmpss_avx512f(auVar54,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar203 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar103);
        bVar13 = fVar202 != fVar203;
        iVar246 = auVar247._0_4_;
        auVar92._16_16_ = auVar49;
        auVar92._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
        auVar91._4_28_ = auVar92._4_28_;
        auVar91._0_4_ = (uint)bVar13 * iVar246 + (uint)!bVar13 * 0x7f800000;
        auVar63 = auVar91._0_16_;
        auVar94._16_16_ = auVar49;
        auVar94._0_16_ = SUB6416(ZEXT464(0xff800000),0);
        auVar93._4_28_ = auVar94._4_28_;
        auVar93._0_4_ = (uint)bVar13 * iVar246 + (uint)!bVar13 * -0x800000;
        auVar61 = auVar93._0_16_;
        uVar12 = vcmpss_avx512f(auVar62,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar204 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar103);
        if ((fVar202 != fVar204) || (NAN(fVar202) || NAN(fVar204))) {
          fVar202 = auVar62._0_4_;
          bVar13 = fVar202 == fVar201;
          if ((!bVar13) || (NAN(fVar202) || NAN(fVar201))) {
            auVar53 = vxorps_avx512vl(auVar53,auVar242._0_16_);
            auVar232._0_4_ = auVar53._0_4_ / (fVar202 - fVar201);
            auVar232._4_12_ = auVar53._4_12_;
            auVar53 = vsubss_avx512f(auVar132,auVar232);
            auVar62 = vfmadd213ss_avx512f(auVar53,auVar55,auVar232);
            auVar53 = auVar62;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar96._16_16_ = auVar49;
            auVar96._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar95._4_28_ = auVar96._4_28_;
            auVar95._0_4_ = (uint)bVar13 * iVar246 + (uint)!bVar13 * 0x7f800000;
            auVar62 = auVar95._0_16_;
            auVar53 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar63 = vminss_avx(auVar63,auVar62);
          auVar61 = vmaxss_avx(auVar53,auVar61);
        }
        uVar12 = vcmpss_avx512f(auVar52,auVar55,1);
        bVar13 = (bool)((byte)uVar12 & 1);
        fVar201 = (float)((uint)bVar13 * -0x40800000 + (uint)!bVar13 * iVar103);
        if ((fVar203 != fVar201) || (NAN(fVar203) || NAN(fVar201))) {
          bVar13 = fVar190 == fVar104;
          if ((!bVar13) || (NAN(fVar190) || NAN(fVar104))) {
            auVar54 = vxorps_avx512vl(auVar54,auVar242._0_16_);
            auVar194._0_4_ = auVar54._0_4_ / (fVar190 - fVar104);
            auVar194._4_12_ = auVar54._4_12_;
            auVar54 = vsubss_avx512f(auVar132,auVar194);
            auVar52 = vfmadd213ss_avx512f(auVar54,auVar55,auVar194);
            auVar54 = auVar52;
          }
          else {
            vucomiss_avx512f(auVar55);
            auVar98._16_16_ = auVar49;
            auVar98._0_16_ = SUB6416(ZEXT464(0x7f800000),0);
            auVar97._4_28_ = auVar98._4_28_;
            auVar97._0_4_ = (uint)bVar13 * iVar246 + (uint)!bVar13 * 0x7f800000;
            auVar52 = auVar97._0_16_;
            auVar54 = ZEXT416((uint)bVar13 * 0x3f800000 + (uint)!bVar13 * -0x800000);
          }
          auVar63 = vminss_avx(auVar63,auVar52);
          auVar61 = vmaxss_avx(auVar54,auVar61);
        }
        bVar13 = fVar204 != fVar201;
        auVar54 = vminss_avx512f(auVar63,auVar132);
        auVar100._16_16_ = auVar49;
        auVar100._0_16_ = auVar63;
        auVar99._4_28_ = auVar100._4_28_;
        auVar99._0_4_ = (uint)bVar13 * auVar54._0_4_ + (uint)!bVar13 * auVar63._0_4_;
        auVar54 = vmaxss_avx512f(auVar132,auVar61);
        auVar102._16_16_ = auVar49;
        auVar102._0_16_ = auVar61;
        auVar101._4_28_ = auVar102._4_28_;
        auVar101._0_4_ = (uint)bVar13 * auVar54._0_4_ + (uint)!bVar13 * auVar61._0_4_;
        auVar54 = vmaxss_avx512f(auVar55,auVar99._0_16_);
        auVar52 = vminss_avx512f(auVar101._0_16_,auVar132);
        bVar13 = true;
        if (auVar54._0_4_ <= auVar52._0_4_) {
          auVar55 = vmaxss_avx512f(auVar55,ZEXT416((uint)(auVar54._0_4_ + -0.1)));
          auVar56 = vminss_avx512f(ZEXT416((uint)(auVar52._0_4_ + 0.1)),auVar132);
          auVar114._0_8_ = auVar59._0_8_;
          auVar114._8_8_ = auVar114._0_8_;
          auVar185._8_8_ = auVar150._0_8_;
          auVar185._0_8_ = auVar150._0_8_;
          auVar195._8_8_ = auVar159._0_8_;
          auVar195._0_8_ = auVar159._0_8_;
          auVar54 = vshufpd_avx(auVar150,auVar150,3);
          auVar52 = vshufpd_avx(auVar159,auVar159,3);
          auVar61 = vshufps_avx(auVar55,auVar56,0);
          auVar57 = vsubps_avx512vl(auVar42,auVar61);
          fVar104 = auVar61._0_4_;
          auVar229._0_4_ = fVar104 * auVar64._0_4_;
          fVar190 = auVar61._4_4_;
          auVar229._4_4_ = fVar190 * auVar64._4_4_;
          fVar201 = auVar61._8_4_;
          auVar229._8_4_ = fVar201 * auVar64._8_4_;
          fVar202 = auVar61._12_4_;
          auVar229._12_4_ = fVar202 * auVar64._12_4_;
          auVar151._0_4_ = fVar104 * auVar54._0_4_;
          auVar151._4_4_ = fVar190 * auVar54._4_4_;
          auVar151._8_4_ = fVar201 * auVar54._8_4_;
          auVar151._12_4_ = fVar202 * auVar54._12_4_;
          auVar154._0_4_ = fVar104 * auVar52._0_4_;
          auVar154._4_4_ = fVar190 * auVar52._4_4_;
          auVar154._8_4_ = fVar201 * auVar52._8_4_;
          auVar154._12_4_ = fVar202 * auVar52._12_4_;
          auVar137._0_4_ = fVar104 * auVar60._0_4_;
          auVar137._4_4_ = fVar190 * auVar60._4_4_;
          auVar137._8_4_ = fVar201 * auVar60._8_4_;
          auVar137._12_4_ = fVar202 * auVar60._12_4_;
          auVar53 = vfmadd231ps_fma(auVar229,auVar57,auVar114);
          auVar62 = vfmadd231ps_fma(auVar151,auVar57,auVar185);
          auVar63 = vfmadd231ps_fma(auVar154,auVar57,auVar195);
          auVar64 = vfmadd231ps_fma(auVar137,auVar57,ZEXT816(0));
          auVar54 = vsubss_avx512f(auVar132,auVar55);
          auVar52 = vmovshdup_avx512vl(auVar237);
          auVar58 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar52._0_4_ * auVar55._0_4_)),auVar237,
                                        auVar54);
          auVar54 = vsubss_avx512f(auVar132,auVar56);
          auVar59 = vfmadd231ss_avx512f(ZEXT416((uint)(auVar56._0_4_ * auVar52._0_4_)),auVar237,
                                        auVar54);
          auVar60 = vdivss_avx512f(auVar132,auVar51);
          auVar51 = vsubps_avx(auVar62,auVar53);
          auVar52 = vmulps_avx512vl(auVar51,auVar38);
          auVar51 = vsubps_avx(auVar63,auVar62);
          auVar61 = vmulps_avx512vl(auVar51,auVar38);
          auVar51 = vsubps_avx(auVar64,auVar63);
          auVar51 = vmulps_avx512vl(auVar51,auVar38);
          auVar54 = vminps_avx(auVar61,auVar51);
          auVar51 = vmaxps_avx(auVar61,auVar51);
          auVar54 = vminps_avx(auVar52,auVar54);
          auVar51 = vmaxps_avx(auVar52,auVar51);
          auVar52 = vshufpd_avx(auVar54,auVar54,3);
          auVar61 = vshufpd_avx(auVar51,auVar51,3);
          auVar54 = vminps_avx(auVar54,auVar52);
          auVar51 = vmaxps_avx(auVar51,auVar61);
          fVar104 = auVar60._0_4_;
          auVar174._0_4_ = fVar104 * auVar54._0_4_;
          auVar174._4_4_ = fVar104 * auVar54._4_4_;
          auVar174._8_4_ = fVar104 * auVar54._8_4_;
          auVar174._12_4_ = fVar104 * auVar54._12_4_;
          auVar164._0_4_ = fVar104 * auVar51._0_4_;
          auVar164._4_4_ = fVar104 * auVar51._4_4_;
          auVar164._8_4_ = fVar104 * auVar51._8_4_;
          auVar164._12_4_ = fVar104 * auVar51._12_4_;
          auVar60 = vdivss_avx512f(auVar132,ZEXT416((uint)(auVar59._0_4_ - auVar58._0_4_)));
          auVar51 = vshufpd_avx(auVar53,auVar53,3);
          auVar54 = vshufpd_avx(auVar62,auVar62,3);
          auVar52 = vshufpd_avx(auVar63,auVar63,3);
          auVar61 = vshufpd_avx(auVar64,auVar64,3);
          auVar51 = vsubps_avx(auVar51,auVar53);
          auVar53 = vsubps_avx(auVar54,auVar62);
          auVar62 = vsubps_avx(auVar52,auVar63);
          auVar61 = vsubps_avx(auVar61,auVar64);
          auVar54 = vminps_avx(auVar51,auVar53);
          auVar51 = vmaxps_avx(auVar51,auVar53);
          auVar52 = vminps_avx(auVar62,auVar61);
          auVar52 = vminps_avx(auVar54,auVar52);
          auVar54 = vmaxps_avx(auVar62,auVar61);
          auVar51 = vmaxps_avx(auVar51,auVar54);
          fVar104 = auVar60._0_4_;
          auVar196._0_4_ = fVar104 * auVar52._0_4_;
          auVar196._4_4_ = fVar104 * auVar52._4_4_;
          auVar196._8_4_ = fVar104 * auVar52._8_4_;
          auVar196._12_4_ = fVar104 * auVar52._12_4_;
          auVar208._0_4_ = fVar104 * auVar51._0_4_;
          auVar208._4_4_ = fVar104 * auVar51._4_4_;
          auVar208._8_4_ = fVar104 * auVar51._8_4_;
          auVar208._12_4_ = fVar104 * auVar51._12_4_;
          auVar159 = vinsertps_avx512f(auVar50,auVar58,0x10);
          auVar53 = vinsertps_avx(auVar40,auVar59,0x10);
          auVar106._0_4_ = auVar159._0_4_ + auVar53._0_4_;
          auVar106._4_4_ = auVar159._4_4_ + auVar53._4_4_;
          auVar106._8_4_ = auVar159._8_4_ + auVar53._8_4_;
          auVar106._12_4_ = auVar159._12_4_ + auVar53._12_4_;
          auVar15._8_4_ = 0x3f000000;
          auVar15._0_8_ = 0x3f0000003f000000;
          auVar15._12_4_ = 0x3f000000;
          auVar56 = vmulps_avx512vl(auVar106,auVar15);
          auVar52 = vshufps_avx(auVar56,auVar56,0x54);
          uVar110 = auVar56._0_4_;
          auVar124._4_4_ = uVar110;
          auVar124._0_4_ = uVar110;
          auVar124._8_4_ = uVar110;
          auVar124._12_4_ = uVar110;
          auVar54 = vfmadd213ps_fma(auVar47,auVar124,auVar48);
          auVar62 = vfmadd213ps_avx512vl(auVar46,auVar124,auVar45);
          auVar61 = vfmadd213ps_fma(auVar43,auVar124,auVar44);
          auVar51 = vsubps_avx(auVar62,auVar54);
          auVar54 = vfmadd213ps_fma(auVar51,auVar124,auVar54);
          auVar51 = vsubps_avx(auVar61,auVar62);
          auVar51 = vfmadd213ps_fma(auVar51,auVar124,auVar62);
          auVar51 = vsubps_avx(auVar51,auVar54);
          auVar54 = vfmadd231ps_fma(auVar54,auVar51,auVar124);
          auVar63 = vmulps_avx512vl(auVar51,auVar38);
          auVar220._8_8_ = auVar54._0_8_;
          auVar220._0_8_ = auVar54._0_8_;
          auVar51 = vshufpd_avx(auVar54,auVar54,3);
          auVar54 = vshufps_avx(auVar56,auVar56,0x55);
          auVar61 = vsubps_avx(auVar51,auVar220);
          auVar62 = vfmadd231ps_fma(auVar220,auVar54,auVar61);
          auVar233._8_8_ = auVar63._0_8_;
          auVar233._0_8_ = auVar63._0_8_;
          auVar51 = vshufpd_avx(auVar63,auVar63,3);
          auVar51 = vsubps_avx(auVar51,auVar233);
          auVar54 = vfmadd213ps_fma(auVar51,auVar54,auVar233);
          auVar125._0_8_ = auVar61._0_8_ ^ 0x8000000080000000;
          auVar125._8_4_ = auVar61._8_4_ ^ 0x80000000;
          auVar125._12_4_ = auVar61._12_4_ ^ 0x80000000;
          auVar51 = vmovshdup_avx(auVar54);
          auVar234._0_8_ = auVar51._0_8_ ^ 0x8000000080000000;
          auVar234._8_4_ = auVar51._8_4_ ^ 0x80000000;
          auVar234._12_4_ = auVar51._12_4_ ^ 0x80000000;
          auVar63 = vmovshdup_avx512vl(auVar61);
          auVar64 = vpermt2ps_avx512vl(auVar234,ZEXT416(5),auVar61);
          auVar51 = vfmsub231ss_avx512f(ZEXT416((uint)(auVar51._0_4_ * auVar61._0_4_)),auVar54,
                                        auVar63);
          auVar54 = vpermt2ps_avx512vl(auVar54,SUB6416(ZEXT464(4),0),auVar125);
          auVar138._0_4_ = auVar51._0_4_;
          auVar138._4_4_ = auVar138._0_4_;
          auVar138._8_4_ = auVar138._0_4_;
          auVar138._12_4_ = auVar138._0_4_;
          auVar51 = vdivps_avx(auVar64,auVar138);
          auVar54 = vdivps_avx(auVar54,auVar138);
          fVar190 = auVar62._0_4_;
          auVar61 = vshufps_avx(auVar62,auVar62,0x55);
          fVar104 = auVar54._0_4_;
          auVar221._0_4_ = fVar190 * auVar51._0_4_ + auVar61._0_4_ * fVar104;
          auVar221._4_4_ = fVar190 * auVar51._4_4_ + auVar61._4_4_ * auVar54._4_4_;
          auVar221._8_4_ = fVar190 * auVar51._8_4_ + auVar61._8_4_ * auVar54._8_4_;
          auVar221._12_4_ = fVar190 * auVar51._12_4_ + auVar61._12_4_ * auVar54._12_4_;
          auVar57 = vsubps_avx(auVar52,auVar221);
          auVar62 = vmovshdup_avx(auVar51);
          auVar52 = vinsertps_avx(auVar174,auVar196,0x1c);
          auVar235._0_4_ = auVar62._0_4_ * auVar52._0_4_;
          auVar235._4_4_ = auVar62._4_4_ * auVar52._4_4_;
          auVar235._8_4_ = auVar62._8_4_ * auVar52._8_4_;
          auVar235._12_4_ = auVar62._12_4_ * auVar52._12_4_;
          auVar61 = vinsertps_avx(auVar164,auVar208,0x1c);
          auVar222._0_4_ = auVar62._0_4_ * auVar61._0_4_;
          auVar222._4_4_ = auVar62._4_4_ * auVar61._4_4_;
          auVar222._8_4_ = auVar62._8_4_ * auVar61._8_4_;
          auVar222._12_4_ = auVar62._12_4_ * auVar61._12_4_;
          auVar55 = vminps_avx512vl(auVar235,auVar222);
          auVar64 = vmaxps_avx(auVar222,auVar235);
          auVar60 = vmovshdup_avx(auVar54);
          auVar62 = vinsertps_avx(auVar196,auVar174,0x4c);
          auVar197._0_4_ = auVar60._0_4_ * auVar62._0_4_;
          auVar197._4_4_ = auVar60._4_4_ * auVar62._4_4_;
          auVar197._8_4_ = auVar60._8_4_ * auVar62._8_4_;
          auVar197._12_4_ = auVar60._12_4_ * auVar62._12_4_;
          auVar63 = vinsertps_avx(auVar208,auVar164,0x4c);
          auVar209._0_4_ = auVar60._0_4_ * auVar63._0_4_;
          auVar209._4_4_ = auVar60._4_4_ * auVar63._4_4_;
          auVar209._8_4_ = auVar60._8_4_ * auVar63._8_4_;
          auVar209._12_4_ = auVar60._12_4_ * auVar63._12_4_;
          auVar60 = vminps_avx(auVar197,auVar209);
          auVar55 = vaddps_avx512vl(auVar55,auVar60);
          auVar60 = vmaxps_avx(auVar209,auVar197);
          auVar198._0_4_ = auVar64._0_4_ + auVar60._0_4_;
          auVar198._4_4_ = auVar64._4_4_ + auVar60._4_4_;
          auVar198._8_4_ = auVar64._8_4_ + auVar60._8_4_;
          auVar198._12_4_ = auVar64._12_4_ + auVar60._12_4_;
          auVar210._8_8_ = 0x3f80000000000000;
          auVar210._0_8_ = 0x3f80000000000000;
          auVar64 = vsubps_avx(auVar210,auVar198);
          auVar60 = vsubps_avx(auVar210,auVar55);
          auVar55 = vsubps_avx(auVar159,auVar56);
          auVar56 = vsubps_avx(auVar53,auVar56);
          fVar204 = auVar55._0_4_;
          auVar236._0_4_ = fVar204 * auVar64._0_4_;
          fVar205 = auVar55._4_4_;
          auVar236._4_4_ = fVar205 * auVar64._4_4_;
          fVar217 = auVar55._8_4_;
          auVar236._8_4_ = fVar217 * auVar64._8_4_;
          fVar225 = auVar55._12_4_;
          auVar236._12_4_ = fVar225 * auVar64._12_4_;
          auVar65 = vbroadcastss_avx512vl(auVar51);
          auVar52 = vmulps_avx512vl(auVar65,auVar52);
          auVar61 = vmulps_avx512vl(auVar65,auVar61);
          auVar65 = vminps_avx512vl(auVar52,auVar61);
          auVar52 = vmaxps_avx(auVar61,auVar52);
          auVar175._0_4_ = fVar104 * auVar62._0_4_;
          auVar175._4_4_ = fVar104 * auVar62._4_4_;
          auVar175._8_4_ = fVar104 * auVar62._8_4_;
          auVar175._12_4_ = fVar104 * auVar62._12_4_;
          auVar165._0_4_ = fVar104 * auVar63._0_4_;
          auVar165._4_4_ = fVar104 * auVar63._4_4_;
          auVar165._8_4_ = fVar104 * auVar63._8_4_;
          auVar165._12_4_ = fVar104 * auVar63._12_4_;
          auVar61 = vminps_avx(auVar175,auVar165);
          auVar62 = vaddps_avx512vl(auVar65,auVar61);
          auVar63 = vmulps_avx512vl(auVar55,auVar60);
          fVar190 = auVar56._0_4_;
          auVar199._0_4_ = fVar190 * auVar64._0_4_;
          fVar201 = auVar56._4_4_;
          auVar199._4_4_ = fVar201 * auVar64._4_4_;
          fVar202 = auVar56._8_4_;
          auVar199._8_4_ = fVar202 * auVar64._8_4_;
          fVar203 = auVar56._12_4_;
          auVar199._12_4_ = fVar203 * auVar64._12_4_;
          auVar211._0_4_ = fVar190 * auVar60._0_4_;
          auVar211._4_4_ = fVar201 * auVar60._4_4_;
          auVar211._8_4_ = fVar202 * auVar60._8_4_;
          auVar211._12_4_ = fVar203 * auVar60._12_4_;
          auVar61 = vmaxps_avx(auVar165,auVar175);
          auVar166._0_4_ = auVar52._0_4_ + auVar61._0_4_;
          auVar166._4_4_ = auVar52._4_4_ + auVar61._4_4_;
          auVar166._8_4_ = auVar52._8_4_ + auVar61._8_4_;
          auVar166._12_4_ = auVar52._12_4_ + auVar61._12_4_;
          auVar176._8_8_ = 0x3f800000;
          auVar176._0_8_ = 0x3f800000;
          auVar52 = vsubps_avx(auVar176,auVar166);
          auVar61 = vsubps_avx(auVar176,auVar62);
          auVar230._0_4_ = fVar204 * auVar52._0_4_;
          auVar230._4_4_ = fVar205 * auVar52._4_4_;
          auVar230._8_4_ = fVar217 * auVar52._8_4_;
          auVar230._12_4_ = fVar225 * auVar52._12_4_;
          auVar223._0_4_ = fVar204 * auVar61._0_4_;
          auVar223._4_4_ = fVar205 * auVar61._4_4_;
          auVar223._8_4_ = fVar217 * auVar61._8_4_;
          auVar223._12_4_ = fVar225 * auVar61._12_4_;
          auVar167._0_4_ = fVar190 * auVar52._0_4_;
          auVar167._4_4_ = fVar201 * auVar52._4_4_;
          auVar167._8_4_ = fVar202 * auVar52._8_4_;
          auVar167._12_4_ = fVar203 * auVar52._12_4_;
          auVar177._0_4_ = fVar190 * auVar61._0_4_;
          auVar177._4_4_ = fVar201 * auVar61._4_4_;
          auVar177._8_4_ = fVar202 * auVar61._8_4_;
          auVar177._12_4_ = fVar203 * auVar61._12_4_;
          auVar52 = vminps_avx(auVar230,auVar223);
          auVar61 = vminps_avx(auVar167,auVar177);
          auVar62 = vminps_avx(auVar52,auVar61);
          auVar52 = vmaxps_avx(auVar223,auVar230);
          auVar61 = vmaxps_avx(auVar177,auVar167);
          auVar61 = vmaxps_avx(auVar61,auVar52);
          auVar64 = vminps_avx512vl(auVar236,auVar63);
          auVar52 = vminps_avx(auVar199,auVar211);
          auVar52 = vminps_avx(auVar64,auVar52);
          auVar52 = vhaddps_avx(auVar62,auVar52);
          auVar63 = vmaxps_avx512vl(auVar63,auVar236);
          auVar62 = vmaxps_avx(auVar211,auVar199);
          auVar62 = vmaxps_avx(auVar62,auVar63);
          auVar61 = vhaddps_avx(auVar61,auVar62);
          auVar52 = vshufps_avx(auVar52,auVar52,0xe8);
          auVar61 = vshufps_avx(auVar61,auVar61,0xe8);
          auVar168._0_4_ = auVar52._0_4_ + auVar57._0_4_;
          auVar168._4_4_ = auVar52._4_4_ + auVar57._4_4_;
          auVar168._8_4_ = auVar52._8_4_ + auVar57._8_4_;
          auVar168._12_4_ = auVar52._12_4_ + auVar57._12_4_;
          auVar178._0_4_ = auVar61._0_4_ + auVar57._0_4_;
          auVar178._4_4_ = auVar61._4_4_ + auVar57._4_4_;
          auVar178._8_4_ = auVar61._8_4_ + auVar57._8_4_;
          auVar178._12_4_ = auVar61._12_4_ + auVar57._12_4_;
          auVar52 = vmaxps_avx(auVar159,auVar168);
          auVar61 = vminps_avx(auVar178,auVar53);
          uVar33 = vcmpps_avx512vl(auVar61,auVar52,1);
          local_368 = vinsertps_avx(auVar58,auVar59,0x10);
          auVar239 = ZEXT1664(local_368);
          auVar52 = ZEXT416(5);
          if ((uVar33 & 3) == 0) {
            vucomiss_avx512f(auVar50);
            auVar52 = vxorps_avx512vl(auVar52,auVar52);
            auVar247 = ZEXT1664(auVar52);
            if ((uint)uVar28 < 4 && (uVar4 == 0 || lVar31 == 0)) {
              bVar13 = false;
            }
            else {
              lVar31 = 200;
              do {
                auVar61 = vsubss_avx512f(auVar132,auVar57);
                fVar202 = auVar61._0_4_;
                fVar190 = fVar202 * fVar202 * fVar202;
                fVar203 = auVar57._0_4_;
                fVar201 = fVar203 * 3.0 * fVar202 * fVar202;
                fVar202 = fVar202 * fVar203 * fVar203 * 3.0;
                auVar152._4_4_ = fVar190;
                auVar152._0_4_ = fVar190;
                auVar152._8_4_ = fVar190;
                auVar152._12_4_ = fVar190;
                auVar145._4_4_ = fVar201;
                auVar145._0_4_ = fVar201;
                auVar145._8_4_ = fVar201;
                auVar145._12_4_ = fVar201;
                auVar115._4_4_ = fVar202;
                auVar115._0_4_ = fVar202;
                auVar115._8_4_ = fVar202;
                auVar115._12_4_ = fVar202;
                fVar203 = fVar203 * fVar203 * fVar203;
                auVar155._0_4_ = (float)local_348._0_4_ * fVar203;
                auVar155._4_4_ = (float)local_348._4_4_ * fVar203;
                auVar155._8_4_ = fStack_340 * fVar203;
                auVar155._12_4_ = fStack_33c * fVar203;
                auVar61 = vfmadd231ps_fma(auVar155,auVar44,auVar115);
                auVar61 = vfmadd231ps_fma(auVar61,auVar45,auVar145);
                auVar61 = vfmadd231ps_fma(auVar61,auVar48,auVar152);
                auVar116._8_8_ = auVar61._0_8_;
                auVar116._0_8_ = auVar61._0_8_;
                auVar61 = vshufpd_avx(auVar61,auVar61,3);
                auVar53 = vshufps_avx(auVar57,auVar57,0x55);
                auVar61 = vsubps_avx(auVar61,auVar116);
                auVar53 = vfmadd213ps_fma(auVar61,auVar53,auVar116);
                fVar190 = auVar53._0_4_;
                auVar61 = vshufps_avx(auVar53,auVar53,0x55);
                auVar117._0_4_ = auVar51._0_4_ * fVar190 + fVar104 * auVar61._0_4_;
                auVar117._4_4_ = auVar51._4_4_ * fVar190 + auVar54._4_4_ * auVar61._4_4_;
                auVar117._8_4_ = auVar51._8_4_ * fVar190 + auVar54._8_4_ * auVar61._8_4_;
                auVar117._12_4_ = auVar51._12_4_ * fVar190 + auVar54._12_4_ * auVar61._12_4_;
                auVar57 = vsubps_avx(auVar57,auVar117);
                auVar61 = vandps_avx512vl(auVar53,auVar241._0_16_);
                auVar53 = vprolq_avx512vl(auVar61,0x20);
                auVar61 = vmaxss_avx(auVar53,auVar61);
                bVar37 = auVar61._0_4_ <= (float)local_358._0_4_;
                if (auVar61._0_4_ < (float)local_358._0_4_) {
                  auVar51 = vucomiss_avx512f(auVar52);
                  if (bVar37) {
                    auVar132 = vucomiss_avx512f(auVar51);
                    auVar244 = ZEXT1664(auVar132);
                    if (bVar37) {
                      vmovshdup_avx(auVar51);
                      auVar132 = vucomiss_avx512f(auVar52);
                      if (bVar37) {
                        auVar54 = vucomiss_avx512f(auVar132);
                        auVar244 = ZEXT1664(auVar54);
                        if (bVar37) {
                          auVar61 = vinsertps_avx(ZEXT416((uint)pre->ray_space[k].vx.field_0.m128[2]
                                                         ),ZEXT416((uint)pre->ray_space[k].vy.
                                                                         field_0.m128[2]),0x1c);
                          auVar56 = vinsertps_avx(auVar61,ZEXT416((uint)pre->ray_space[k].vz.field_0
                                                                        .m128[2]),0x28);
                          auVar61 = vdpps_avx(auVar56,local_178,0x7f);
                          auVar53 = vdpps_avx(auVar56,local_188,0x7f);
                          auVar62 = vdpps_avx(auVar56,local_198,0x7f);
                          auVar63 = vdpps_avx(auVar56,local_1a8,0x7f);
                          auVar64 = vdpps_avx(auVar56,local_1b8,0x7f);
                          auVar60 = vdpps_avx(auVar56,local_1c8,0x7f);
                          auVar55 = vdpps_avx(auVar56,local_1d8,0x7f);
                          auVar56 = vdpps_avx(auVar56,local_1e8,0x7f);
                          auVar57 = vsubss_avx512f(auVar54,auVar132);
                          fVar104 = auVar132._0_4_;
                          auVar132 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar64._0_4_)),
                                                     auVar57,auVar61);
                          auVar61 = vfmadd231ss_fma(ZEXT416((uint)(auVar60._0_4_ * fVar104)),auVar57
                                                    ,auVar53);
                          auVar53 = vfmadd231ss_fma(ZEXT416((uint)(auVar55._0_4_ * fVar104)),auVar57
                                                    ,auVar62);
                          auVar62 = vfmadd231ss_fma(ZEXT416((uint)(fVar104 * auVar56._0_4_)),auVar57
                                                    ,auVar63);
                          auVar54 = vsubss_avx512f(auVar54,auVar51);
                          auVar169._0_4_ = auVar54._0_4_;
                          fVar104 = auVar169._0_4_ * auVar169._0_4_ * auVar169._0_4_;
                          local_118 = auVar51._0_4_;
                          fVar190 = local_118 * 3.0 * auVar169._0_4_ * auVar169._0_4_;
                          fVar201 = auVar169._0_4_ * local_118 * local_118 * 3.0;
                          fVar203 = local_118 * local_118 * local_118;
                          auVar54 = vfmadd231ss_fma(ZEXT416((uint)(fVar203 * auVar62._0_4_)),
                                                    ZEXT416((uint)fVar201),auVar53);
                          auVar54 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar190),auVar61);
                          auVar132 = vfmadd231ss_fma(auVar54,ZEXT416((uint)fVar104),auVar132);
                          fVar202 = auVar132._0_4_;
                          if ((fVar171 <= fVar202) &&
                             (fVar204 = *(float *)(ray + k * 4 + 0x80), fVar202 <= fVar204)) {
                            local_108 = vshufps_avx(auVar51,auVar51,0x55);
                            auVar54 = vsubps_avx512vl(auVar42,local_108);
                            fVar205 = local_108._0_4_;
                            auVar186._0_4_ = fVar205 * (float)local_208._0_4_;
                            fVar217 = local_108._4_4_;
                            auVar186._4_4_ = fVar217 * (float)local_208._4_4_;
                            fVar225 = local_108._8_4_;
                            auVar186._8_4_ = fVar225 * fStack_200;
                            fVar226 = local_108._12_4_;
                            auVar186._12_4_ = fVar226 * fStack_1fc;
                            auVar200._0_4_ = fVar205 * (float)local_258._0_4_;
                            auVar200._4_4_ = fVar217 * (float)local_258._4_4_;
                            auVar200._8_4_ = fVar225 * fStack_250;
                            auVar200._12_4_ = fVar226 * fStack_24c;
                            auVar212._0_4_ = fVar205 * (float)local_268._0_4_;
                            auVar212._4_4_ = fVar217 * (float)local_268._4_4_;
                            auVar212._8_4_ = fVar225 * fStack_260;
                            auVar212._12_4_ = fVar226 * fStack_25c;
                            auVar224._0_4_ = fVar205 * (float)local_228._0_4_;
                            auVar224._4_4_ = fVar217 * (float)local_228._4_4_;
                            auVar224._8_4_ = fVar225 * fStack_220;
                            auVar224._12_4_ = fVar226 * fStack_21c;
                            auVar42 = vfmadd231ps_fma(auVar186,auVar54,local_1f8);
                            auVar51 = vfmadd231ps_fma(auVar200,auVar54,local_238);
                            auVar132 = vfmadd231ps_fma(auVar212,auVar54,local_248);
                            auVar54 = vfmadd231ps_fma(auVar224,auVar54,local_218);
                            auVar42 = vsubps_avx(auVar51,auVar42);
                            auVar51 = vsubps_avx(auVar132,auVar51);
                            auVar132 = vsubps_avx(auVar54,auVar132);
                            auVar213._0_4_ = auVar51._0_4_ * local_118;
                            auVar213._4_4_ = auVar51._4_4_ * local_118;
                            auVar213._8_4_ = auVar51._8_4_ * local_118;
                            auVar213._12_4_ = auVar51._12_4_ * local_118;
                            auVar169._4_4_ = auVar169._0_4_;
                            auVar169._8_4_ = auVar169._0_4_;
                            auVar169._12_4_ = auVar169._0_4_;
                            auVar42 = vfmadd231ps_fma(auVar213,auVar169,auVar42);
                            auVar179._0_4_ = auVar132._0_4_ * local_118;
                            auVar179._4_4_ = auVar132._4_4_ * local_118;
                            auVar179._8_4_ = auVar132._8_4_ * local_118;
                            auVar179._12_4_ = auVar132._12_4_ * local_118;
                            auVar51 = vfmadd231ps_fma(auVar179,auVar169,auVar51);
                            auVar180._0_4_ = auVar51._0_4_ * local_118;
                            auVar180._4_4_ = auVar51._4_4_ * local_118;
                            auVar180._8_4_ = auVar51._8_4_ * local_118;
                            auVar180._12_4_ = auVar51._12_4_ * local_118;
                            auVar42 = vfmadd231ps_fma(auVar180,auVar169,auVar42);
                            auVar38 = vmulps_avx512vl(auVar42,auVar38);
                            pGVar5 = (context->scene->geometries).items[uVar34].ptr;
                            if ((pGVar5->mask & *(uint *)(ray + k * 4 + 0x90)) == 0) {
                              bVar37 = false;
                            }
                            else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                                    (bVar37 = true,
                                    pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar156._0_4_ = fVar203 * (float)local_2b8._0_4_;
                              auVar156._4_4_ = fVar203 * (float)local_2b8._4_4_;
                              auVar156._8_4_ = fVar203 * fStack_2b0;
                              auVar156._12_4_ = fVar203 * fStack_2ac;
                              auVar153._4_4_ = fVar201;
                              auVar153._0_4_ = fVar201;
                              auVar153._8_4_ = fVar201;
                              auVar153._12_4_ = fVar201;
                              auVar42 = vfmadd132ps_fma(auVar153,auVar156,local_2a8);
                              auVar139._4_4_ = fVar190;
                              auVar139._0_4_ = fVar190;
                              auVar139._8_4_ = fVar190;
                              auVar139._12_4_ = fVar190;
                              auVar42 = vfmadd132ps_fma(auVar139,auVar42,local_298);
                              auVar126._4_4_ = fVar104;
                              auVar126._0_4_ = fVar104;
                              auVar126._8_4_ = fVar104;
                              auVar126._12_4_ = fVar104;
                              auVar132 = vfmadd132ps_fma(auVar126,auVar42,local_288);
                              auVar42 = vshufps_avx(auVar132,auVar132,0xc9);
                              auVar51 = vshufps_avx(auVar38,auVar38,0xc9);
                              auVar127._0_4_ = auVar132._0_4_ * auVar51._0_4_;
                              auVar127._4_4_ = auVar132._4_4_ * auVar51._4_4_;
                              auVar127._8_4_ = auVar132._8_4_ * auVar51._8_4_;
                              auVar127._12_4_ = auVar132._12_4_ * auVar51._12_4_;
                              auVar42 = vfmsub231ps_fma(auVar127,auVar38,auVar42);
                              auVar38 = vshufps_avx(auVar42,auVar42,0x55);
                              local_138 = vshufps_avx(auVar42,auVar42,0xaa);
                              local_128 = auVar42._0_4_;
                              local_148[0] = (RTCHitN)auVar38[0];
                              local_148[1] = (RTCHitN)auVar38[1];
                              local_148[2] = (RTCHitN)auVar38[2];
                              local_148[3] = (RTCHitN)auVar38[3];
                              local_148[4] = (RTCHitN)auVar38[4];
                              local_148[5] = (RTCHitN)auVar38[5];
                              local_148[6] = (RTCHitN)auVar38[6];
                              local_148[7] = (RTCHitN)auVar38[7];
                              local_148[8] = (RTCHitN)auVar38[8];
                              local_148[9] = (RTCHitN)auVar38[9];
                              local_148[10] = (RTCHitN)auVar38[10];
                              local_148[0xb] = (RTCHitN)auVar38[0xb];
                              local_148[0xc] = (RTCHitN)auVar38[0xc];
                              local_148[0xd] = (RTCHitN)auVar38[0xd];
                              local_148[0xe] = (RTCHitN)auVar38[0xe];
                              local_148[0xf] = (RTCHitN)auVar38[0xf];
                              uStack_124 = local_128;
                              uStack_120 = local_128;
                              uStack_11c = local_128;
                              fStack_114 = local_118;
                              fStack_110 = local_118;
                              fStack_10c = local_118;
                              local_f8 = local_278._0_8_;
                              uStack_f0 = local_278._8_8_;
                              local_e8 = local_2c8;
                              vpcmpeqd_avx2(ZEXT1632(local_2c8),ZEXT1632(local_2c8));
                              uStack_d4 = context->user->instID[0];
                              local_d8 = uStack_d4;
                              uStack_d0 = uStack_d4;
                              uStack_cc = uStack_d4;
                              uStack_c8 = context->user->instPrimID[0];
                              uStack_c4 = uStack_c8;
                              uStack_c0 = uStack_c8;
                              uStack_bc = uStack_c8;
                              *(float *)(ray + k * 4 + 0x80) = fVar202;
                              local_378 = local_2d8._0_8_;
                              uStack_370 = local_2d8._8_8_;
                              local_308.valid = (int *)&local_378;
                              local_308.geometryUserPtr = pGVar5->userPtr;
                              local_308.context = context->user;
                              local_308.ray = (RTCRayN *)ray;
                              local_308.hit = local_148;
                              local_308.N = 4;
                              if (pGVar5->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                (*pGVar5->occlusionFilterN)(&local_308);
                                auVar239 = ZEXT1664(local_368);
                                auVar38 = vxorps_avx512vl(auVar52,auVar52);
                                auVar247 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                auVar245 = ZEXT1664(auVar38);
                                auVar244 = ZEXT464(0x3f800000);
                                auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar243 = ZEXT3264(auVar72);
                                auVar49 = auVar72._16_16_;
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                auVar242 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                auVar241 = ZEXT1664(auVar38);
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                auVar240 = ZEXT1664(auVar38);
                                auVar38 = vxorps_avx512vl(auVar39,auVar39);
                                auVar248 = ZEXT1664(auVar38);
                              }
                              auVar42 = auVar248._0_16_;
                              auVar38 = auVar247._0_16_;
                              auVar24._8_8_ = uStack_370;
                              auVar24._0_8_ = local_378;
                              uVar33 = vptestmd_avx512vl(auVar24,auVar24);
                              if ((uVar33 & 0xf) == 0) {
                                bVar37 = false;
                              }
                              else {
                                p_Var6 = context->args->filter;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar5->field_8).field_0x2 & 0x40) != 0)))) {
                                  (*p_Var6)(&local_308);
                                  auVar239 = ZEXT1664(local_368);
                                  auVar38 = vxorps_avx512vl(auVar38,auVar38);
                                  auVar247 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                                  auVar245 = ZEXT1664(auVar38);
                                  auVar244 = ZEXT464(0x3f800000);
                                  auVar72 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar243 = ZEXT3264(auVar72);
                                  auVar49 = auVar72._16_16_;
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
                                  auVar242 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
                                  auVar241 = ZEXT1664(auVar38);
                                  auVar38 = vbroadcastss_avx512vl(ZEXT416(0x40400000));
                                  auVar240 = ZEXT1664(auVar38);
                                  auVar38 = vxorps_avx512vl(auVar42,auVar42);
                                  auVar248 = ZEXT1664(auVar38);
                                }
                                auVar25._8_8_ = uStack_370;
                                auVar25._0_8_ = local_378;
                                uVar33 = vptestmd_avx512vl(auVar25,auVar25);
                                uVar33 = uVar33 & 0xf;
                                auVar38 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                                bVar37 = (bool)((byte)uVar33 & 1);
                                bVar9 = (bool)((byte)(uVar33 >> 1) & 1);
                                bVar10 = (bool)((byte)(uVar33 >> 2) & 1);
                                bVar11 = SUB81(uVar33 >> 3,0);
                                *(uint *)(local_308.ray + 0x80) =
                                     (uint)bVar37 * auVar38._0_4_ |
                                     (uint)!bVar37 * *(int *)(local_308.ray + 0x80);
                                *(uint *)(local_308.ray + 0x84) =
                                     (uint)bVar9 * auVar38._4_4_ |
                                     (uint)!bVar9 * *(int *)(local_308.ray + 0x84);
                                *(uint *)(local_308.ray + 0x88) =
                                     (uint)bVar10 * auVar38._8_4_ |
                                     (uint)!bVar10 * *(int *)(local_308.ray + 0x88);
                                *(uint *)(local_308.ray + 0x8c) =
                                     (uint)bVar11 * auVar38._12_4_ |
                                     (uint)!bVar11 * *(int *)(local_308.ray + 0x8c);
                                bVar37 = (byte)uVar33 != 0;
                              }
                              if (!bVar37) {
                                *(float *)(ray + k * 4 + 0x80) = fVar204;
                              }
                            }
                            bVar36 = (bool)(bVar36 | bVar37);
                          }
                        }
                      }
                    }
                  }
                  break;
                }
                lVar31 = lVar31 + -1;
              } while (lVar31 != 0);
            }
          }
          else {
            auVar38 = vxorps_avx512vl(ZEXT416(5),auVar52);
            auVar247 = ZEXT1664(auVar38);
          }
        }
        else {
          auVar239 = ZEXT1664(auVar237);
        }
      }
    } while (bVar13);
    auVar38 = vinsertps_avx512f(auVar50,auVar40,0x10);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);

          unsigned int vertexID = geom->curve(primID);
          Vec3ff a0,a1,a2,a3; Vec3fa n0,n1,n2,n3; geom->gather(a0,a1,a2,a3,n0,n1,n2,n3,vertexID);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,n0,n1,n2,n3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }